

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mechanism.cpp
# Opt level: O2

void SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(int *rowVals,int *colPtrs,int *indx,int *consP)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  double dVar50;
  double dVar51;
  double dVar52;
  double dVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  double dVar57;
  double dVar58;
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar63;
  double dVar64;
  double dVar65;
  double dVar66;
  double dVar67;
  double dVar68;
  double dVar69;
  double dVar70;
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  double dVar98;
  double dVar99;
  double dVar100;
  double dVar101;
  double dVar102;
  double dVar103;
  double dVar104;
  double dVar105;
  double dVar106;
  double dVar107;
  double dVar108;
  double dVar109;
  double dVar110;
  double dVar111;
  double dVar112;
  double dVar113;
  double dVar114;
  double dVar115;
  double dVar116;
  double dVar117;
  double dVar118;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  double dVar129;
  double dVar130;
  double dVar131;
  double dVar132;
  double dVar133;
  double dVar134;
  double dVar135;
  double dVar136;
  double dVar137;
  double dVar138;
  double dVar139;
  double dVar140;
  double dVar141;
  double dVar142;
  double dVar143;
  double dVar144;
  double dVar145;
  double dVar146;
  double dVar147;
  double dVar148;
  double dVar149;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  double dVar162;
  double dVar163;
  double dVar164;
  double dVar165;
  double dVar166;
  double dVar167;
  double dVar168;
  double dVar169;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  double dVar174;
  double dVar175;
  double dVar176;
  double dVar177;
  double dVar178;
  double dVar179;
  double dVar180;
  double dVar181;
  double dVar182;
  double dVar183;
  int i;
  double *pdVar184;
  undefined1 (*pauVar185) [16];
  double *pdVar186;
  double *pdVar187;
  int iVar188;
  double *pdVar189;
  double *pdVar190;
  long lVar191;
  double *pdVar192;
  double *pdVar193;
  double *pdVar194;
  int l;
  int iVar195;
  double *pdVar196;
  double *pdVar197;
  long lVar198;
  undefined4 uVar199;
  undefined4 uVar200;
  undefined4 uVar201;
  undefined4 uVar202;
  undefined4 uVar203;
  undefined4 uVar204;
  undefined4 uVar205;
  undefined4 uVar206;
  undefined4 uVar207;
  undefined4 uVar208;
  undefined4 uVar209;
  undefined4 uVar210;
  double dVar211;
  double dVar212;
  double dVar213;
  double dVar214;
  double dVar215;
  double dVar216;
  double dVar217;
  double dVar218;
  double dVar219;
  double dVar220;
  double dVar221;
  double dVar222;
  double dVar223;
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar228;
  double dVar229;
  double dVar230;
  double dVar231;
  double dVar232;
  double dVar233;
  double dVar234;
  double dVar235;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  double dVar243;
  double dVar244;
  double dVar245;
  double dVar246;
  double dVar247;
  double dVar248;
  double dVar249;
  double dVar250;
  double dVar251;
  double dVar252;
  double dVar253;
  double dVar254;
  double dVar255;
  double dVar256;
  double dVar257;
  double dVar258;
  double dVar259;
  double dVar260;
  double dVar261;
  double dVar262;
  double dVar263;
  double dVar264;
  double dVar265;
  double dVar266;
  double dVar267;
  double dVar268;
  double dVar269;
  double dVar270;
  double dVar271;
  undefined4 uVar272;
  undefined4 uVar273;
  undefined4 uVar274;
  undefined4 uVar275;
  double dVar276;
  double dVar277;
  double dVar278;
  double dVar279;
  double dVar280;
  double dVar281;
  double dVar282;
  double dVar283;
  double dVar284;
  double dVar285;
  double dVar286;
  double dVar287;
  double dVar288;
  double dVar289;
  double dVar290;
  double dVar291;
  double dVar292;
  double dVar293;
  double dVar294;
  double dVar295;
  double dVar296;
  double dVar297;
  double dVar298;
  double dVar299;
  double dVar300;
  double dVar301;
  double dVar302;
  double dVar303;
  undefined4 uVar304;
  undefined4 uVar305;
  undefined4 uVar306;
  undefined4 uVar307;
  undefined4 uVar308;
  undefined4 uVar309;
  undefined4 uVar310;
  undefined4 uVar311;
  double dVar312;
  double dVar313;
  double dVar314;
  double dVar315;
  double dVar316;
  double dVar317;
  double dVar318;
  double dVar319;
  double dVar320;
  double dVar321;
  double dVar322;
  double dVar323;
  double dVar324;
  double dVar325;
  double dVar326;
  double dVar327;
  double dVar328;
  double dVar329;
  double dVar330;
  double dVar331;
  double dVar332;
  double dVar333;
  double dVar334;
  double dVar335;
  double dVar336;
  double dVar337;
  double dVar338;
  double dVar339;
  double dVar340;
  double dVar341;
  double dVar342;
  double dVar343;
  double dVar344;
  double dVar345;
  double dVar346;
  double dVar347;
  double dVar348;
  double dVar349;
  double dVar350;
  double dVar351;
  double dVar352;
  double dVar353;
  double dVar354;
  double dVar355;
  double dVar356;
  double dVar357;
  double dVar358;
  double dVar359;
  double dVar360;
  double dVar361;
  double dVar362;
  double dVar363;
  double dVar364;
  double dVar365;
  double dVar366;
  double dVar367;
  double dVar368;
  double dVar369;
  double dVar370;
  double dVar371;
  double dVar372;
  double dVar373;
  double dVar374;
  double dVar375;
  double dVar376;
  double dVar377;
  double dVar378;
  GpuArray<double,_21U> conc;
  Real h_RT [21];
  Real c_R [21];
  Real dcRdT [21];
  double dStack_1690;
  double dStack_1640;
  double local_1608 [22];
  double local_1558;
  double local_1548;
  double local_1538 [22];
  double local_1488;
  double local_1478;
  double dStack_1470;
  double local_1468;
  double dStack_1460;
  double local_1458;
  double dStack_1450;
  double local_1448;
  double dStack_1440;
  double local_1438;
  double dStack_1430;
  double local_1428;
  double dStack_1420;
  double local_1418;
  double dStack_1410;
  double local_1408;
  double dStack_1400;
  double local_13f8;
  double dStack_13f0;
  double local_13e8;
  double dStack_13e0;
  double local_13d8;
  double local_13c8;
  undefined8 uStack_13c0;
  undefined1 local_13b8 [16];
  double local_13a8;
  double dStack_13a0;
  undefined1 local_1398 [16];
  double local_1388;
  undefined8 uStack_1380;
  undefined1 local_1378 [12];
  undefined4 uStack_136c;
  double local_1368;
  double dStack_1360;
  double local_1358 [22];
  double local_12a8;
  double dStack_12a0;
  double local_1298;
  double dStack_1290;
  double local_1288;
  undefined8 uStack_1280;
  double local_1270;
  double local_1268;
  undefined8 uStack_1260;
  undefined1 local_1258 [16];
  double local_1248;
  double dStack_1240;
  double local_1238;
  double dStack_1230;
  undefined1 local_1228 [24];
  double local_1210;
  double local_1208;
  int local_11fc;
  double local_11f8;
  double local_11f0;
  double dStack_11e8;
  double local_11e0;
  double local_11d8;
  double local_11d0;
  double local_11c8;
  double local_11c0;
  double local_11b8;
  double local_11b0;
  double local_11a8;
  double dStack_11a0;
  double local_1198;
  double local_1190;
  double local_1188;
  double local_1180 [2];
  double local_1170;
  double local_1168 [3];
  double adStack_1150 [29];
  undefined1 local_1068 [16];
  double local_1058;
  double local_1050;
  double local_1048;
  double dStack_1040;
  double local_1038;
  double local_1030;
  double dStack_1028;
  double local_1020;
  double local_1018;
  double local_1010;
  double local_1008;
  double local_fe8;
  double local_fe0;
  double local_fd8;
  double dStack_fd0;
  double dStack_fc8;
  double local_fc0;
  double dStack_fb8;
  double local_fb0;
  double local_fa8;
  double local_fa0;
  double local_f98;
  double local_f90;
  double local_f88;
  double local_f80;
  double dStack_f78;
  double dStack_f70;
  double local_f68;
  double local_f60;
  double local_f38;
  double local_f30;
  double dStack_f28;
  double local_f20;
  double dStack_f18;
  double local_f10;
  undefined1 local_f08 [16];
  double local_ef8;
  double local_ef0;
  double local_ee8;
  double local_ee0;
  double dStack_ed8;
  double local_ed0;
  double local_ec8;
  double dStack_ec0;
  double local_eb0;
  double local_ea8;
  double local_e88;
  double local_e80;
  double local_e78;
  double dStack_e70;
  double local_e68;
  double local_e60;
  double local_e58;
  double local_e50;
  double dStack_e48;
  double local_e40;
  double local_e38;
  double local_e30;
  double local_e20;
  double local_e18;
  double local_e00;
  double local_df8;
  double local_dd8;
  double local_dd0;
  double local_dc8;
  double local_dc0;
  double dStack_db8;
  double local_db0;
  double dStack_da8;
  double local_da0;
  double local_d90;
  double local_d88;
  double local_d80;
  double local_d78;
  double local_d70;
  double dStack_d68;
  double dStack_d60;
  double local_d58;
  double local_d50;
  double local_d28;
  double local_d20;
  double local_d18;
  double local_d10;
  double local_d08;
  double local_d00;
  double local_cf8;
  double dStack_cf0;
  double local_ce8;
  double local_ce0;
  double local_cd8;
  double local_cc0;
  double local_cb8;
  double local_ca8;
  double local_c78;
  double local_c70;
  double local_c68;
  double local_c60;
  double local_c58;
  double local_c50;
  double local_c40;
  double local_c38;
  double local_c30;
  undefined1 local_c28 [16];
  double local_c18;
  double local_c10;
  double local_c08;
  double local_bf8;
  double local_bc8;
  double local_bc0;
  double dStack_bb8;
  double local_bb0;
  double dStack_ba8;
  double local_ba0;
  double local_b98;
  double local_b90;
  double dStack_b88;
  double local_b80;
  double local_b78;
  double local_b70;
  double local_b60;
  double dStack_b58;
  double local_b50;
  double local_b48;
  double dStack_b40;
  double local_b38;
  double local_b18;
  double local_b10;
  double local_b08;
  double local_b00;
  double local_af8;
  double local_af0;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  double local_ac8;
  double local_ac0;
  double local_ab0;
  double local_aa8;
  double local_a90;
  double local_a88;
  double local_a68;
  double local_a60;
  double local_a58;
  double local_a50;
  double local_a48;
  double local_a40;
  double local_a38;
  double local_a30;
  double local_a28;
  double local_a20;
  double local_a18;
  double dStack_a10;
  double dStack_a08;
  double dStack_a00;
  double local_9f8;
  double local_9b8;
  double local_9b0;
  double local_9a8;
  double local_9a0;
  double local_998;
  double local_988;
  double local_980;
  double local_978;
  double local_960;
  double local_958;
  double local_950;
  double local_948;
  double local_908;
  double local_900;
  double local_8f8;
  double local_8f0;
  double local_8e8;
  double local_8e0;
  double local_8d8;
  double local_8d0;
  double local_8c8;
  double local_8c0;
  double local_8b8;
  double dStack_8b0;
  double dStack_8a8;
  double local_8a0;
  double local_898;
  double local_888;
  double local_858;
  double local_850;
  double local_848;
  double local_840;
  double local_838;
  double local_830;
  double local_828;
  double dStack_820;
  double dStack_818;
  double local_810;
  double local_808;
  double local_800;
  double local_7f8;
  double local_7f0;
  double local_7e8;
  double local_7e0;
  double local_7d0;
  double local_7a0;
  double local_798;
  double local_790;
  double local_788;
  double local_778;
  double local_760;
  double local_738;
  double local_730;
  double local_6f0;
  double local_6e8;
  double local_6e0;
  double local_6c8;
  double local_6c0;
  double local_6b8;
  double dStack_6b0;
  double local_690;
  double local_678;
  double local_670;
  double local_648;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_620;
  double local_618;
  double local_600;
  double local_5f8;
  double local_5d8;
  double local_5c8;
  double local_5c0;
  double local_5b8;
  double local_598;
  double local_590;
  double local_588;
  double local_578;
  double local_570;
  double local_550;
  double local_548;
  double local_510;
  double local_508;
  double local_4e0;
  double local_4d0;
  double local_4b8;
  double local_4b0;
  double local_4a8;
  double local_430;
  double local_420;
  double local_408;
  double local_400;
  double local_3f8;
  double local_388;
  undefined1 local_380 [16];
  double local_370;
  double dStack_368;
  double local_360;
  double local_358;
  double dStack_350;
  double local_348;
  double local_340;
  double local_338;
  double dStack_330;
  double dStack_328;
  double dStack_320;
  double dStack_318;
  double local_310;
  double local_308;
  undefined1 local_300 [32];
  double local_2e0;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  undefined8 uStack_2a0;
  double *local_298;
  double *local_290;
  double local_288;
  double *local_280;
  double *local_278;
  int *local_270;
  double local_268 [22];
  double local_1b8 [22];
  double local_108;
  undefined8 uStack_100;
  double local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  double local_d8;
  double local_d0 [2];
  double local_c0 [2];
  double local_b0 [2];
  double local_a0 [2];
  double local_90 [2];
  double local_80 [2];
  double local_70 [2];
  double local_60 [2];
  double adStack_50 [2];
  double adStack_40 [2];
  
  local_1398._8_8_ = local_1398._0_8_;
  local_13b8._8_8_ = local_13b8._0_8_;
  stack0xffffffffffffec90 = (double)local_1378._0_8_;
  uStack_13c0 = local_13c8;
  local_1258._8_8_ = local_1258._0_8_;
  pdVar187 = &local_11f8;
  local_270 = colPtrs;
  memset(pdVar187,0,0xf20);
  memset(local_1538,0,0xa8);
  pdVar192 = &local_d8;
  local_290 = adStack_50;
  local_278 = local_1b8 + 0x11;
  local_280 = local_1b8 + 0x13;
  local_298 = adStack_40;
  for (lVar198 = 0; dVar352 = local_1538[7], dVar211 = local_1538[1], lVar198 != 0x15;
      lVar198 = lVar198 + 1) {
    local_1538[lVar198] = 0.047619047619047616;
  }
  local_11fc = *consP;
  for (lVar198 = 0; lVar198 != 0x1e4; lVar198 = lVar198 + 1) {
    (&local_11f8)[lVar198] = 0.0;
  }
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    local_1608[lVar198] = 0.0;
  }
  dVar267 = 0.0;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar267 = dVar267 + local_1538[lVar198];
  }
  local_1478 = 2.9101473600491667;
  dStack_1470 = 19.482439934646393;
  local_1468 = 22.00757879476429;
  dStack_1460 = 3.2555381179699996;
  local_1458 = 6.1092103122075;
  dStack_1450 = -15.524086927680834;
  local_1448 = 5.3818731557687505;
  dStack_1440 = 35.602608086557915;
  local_1438 = 38.543891960460414;
  dStack_1430 = 17.114317783399166;
  local_1428 = 0.4349435637083328;
  dStack_1420 = -5.748131844745;
  local_1418 = -26.605086887896665;
  dStack_1410 = 7.7442483232375;
  local_1408 = -3.2271354189666677;
  dStack_1400 = 8.078776559375;
  local_13f8 = 12.395261584404166;
  dStack_13f0 = 18.914627724425003;
  local_13e8 = 3.874817692333335;
  dStack_13e0 = 3.0794231235708334;
  local_13d8 = 2.0030833333333335;
  dVar277 = local_1538[1] * local_1538[7];
  dVar312 = (((local_1538[0x14] * -0.30000000000000004 +
              local_1538[0x12] + local_1538[0x12] +
              local_1538[0xb] * 0.5 + local_1538[5] * 5.0 + local_1538[0] + dVar267 + local_1538[10]
              + local_1538[0xc]) * 1e-12) / 71955998.06277587) * 2.2543283025642333e+17;
  dVar248 = log10(dVar312);
  dVar246 = 1.0 / ((dVar248 + -0.09006792635084097) * -0.14 + 1.3374831843797492);
  dVar248 = (dVar248 + -0.09006792635084097) * dVar246;
  dVar278 = 1.0 / (dVar248 * dVar248 + 1.0);
  dVar212 = pow(10.0,dVar278 * -0.46258518455098363);
  dVar247 = local_1538[0x12];
  dVar213 = local_1538[0xb];
  dVar333 = local_1538[9];
  dVar249 = dVar278 * -0.9251703691019673 * dVar278 * dVar248 * dVar246;
  dVar246 = dVar249 * -1.3374831843797492 * dVar246;
  dVar212 = dVar212 * (dVar312 / (dVar312 + 1.0));
  dVar244 = (dVar277 * 71955998.06277587 + local_1538[9] * -0.15021418125880825) * dVar212;
  local_1608[7] = local_1608[7] - dVar244;
  local_1358[0] = 0.0;
  local_1358[1] = dVar352 * dVar212 * 71955998.06277587 + 0.0;
  local_1358[2] = 0.0;
  local_1358[3] = 0.0;
  local_1358[4] = 0.0;
  local_1358[5] = 0.0;
  local_1358[6] = 0.0;
  local_1358[7] = dVar212 * 71955998.06277587 * dVar211 + 0.0;
  local_1358[8] = 0.0;
  local_1358[9] = dVar212 * -0.15021418125880825 + 0.0;
  local_1358[10] = 0.0;
  local_1358[0xb] = 0.0;
  local_1358[0xc] = 0.0;
  local_1358[0xd] = 0.0;
  local_1358[0xe] = 0.0;
  local_1358[0xf] = 0.0;
  local_1358[0x14] = 0.0;
  local_1358[0x10] = 0.0;
  local_1358[0x11] = 0.0;
  local_1358[0x12] = 0.0;
  local_1358[0x13] = 0.0;
  pdVar184 = &local_11b0;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar352 = local_1358[lVar198];
    pdVar184[-8] = pdVar184[-8] - dVar352;
    pdVar184[-2] = pdVar184[-2] - dVar352;
    *pdVar184 = dVar352 + *pdVar184;
    pdVar184 = pdVar184 + 0x16;
  }
  dVar352 = dVar212 * (dVar277 * -38376.53230014713 + local_1538[9] * -0.0036222377521367456) +
            ((dVar248 * dVar249 * -1.27 + dVar246 * -0.67 + dVar278) * -0.0001271297967317221 +
             dVar246 * -0.0005580285508678667 + -0.0005580285508678667 / (dVar312 + 1.0)) *
            2.302585092994046 * dVar244;
  pdVar184 = &local_11a8;
  local_380._0_8_ = (double)local_380._0_8_ - dVar352;
  dStack_350 = dStack_350 - dVar352;
  local_340 = dVar352 + local_340;
  local_1558 = local_1538[0];
  local_1288 = local_1538[5];
  local_1258._0_8_ = dVar267 + local_1538[0];
  local_1548 = local_1538[10];
  local_1368 = local_1538[0xc];
  local_1298 = local_1538[0x12] + local_1538[0x12];
  local_13a8 = local_1538[0xb] * 0.5 +
               local_1538[5] * 5.0 + dVar267 + local_1538[0] + local_1538[10] + local_1538[0xc] +
               local_1298;
  local_1488 = local_1538[0x14];
  local_1228._0_8_ = local_1538[0x14] * -0.30000000000000004 + local_13a8;
  local_1228._8_8_ = 0;
  dVar352 = (double)local_1228._0_8_ * 1e-12;
  dVar312 = (dVar352 / 111446030.23051862) * 8.322101603299873e+17;
  dVar212 = dVar211 * local_1538[9];
  dVar248 = log10(dVar312);
  local_13c8 = 1.0 / ((dVar248 + -0.1863137764834265) * -0.14 + 1.1550470206955945);
  local_12a8 = (dVar248 + -0.1863137764834265) * local_13c8;
  local_1378._0_8_ = 1.0 / (local_12a8 * local_12a8 + 1.0);
  dVar248 = pow(10.0,(double)local_1378._0_8_ * -0.31893466196503506);
  dVar278 = dStack_1470;
  dVar277 = local_1538[0xd];
  dVar246 = (double)local_1378._0_8_ * -0.6378693239300701 * (double)local_1378._0_8_ * local_12a8 *
            local_13c8;
  dVar249 = local_12a8 * dVar246;
  dVar246 = dVar246 * -1.1550470206955945 * local_13c8;
  local_12a8 = dStack_1430;
  dVar248 = dVar248 * (dVar312 / (dVar312 + 1.0));
  dVar245 = (dVar212 * 111446030.23051862 + local_1548 * -5.675915683847628) * dVar248;
  dVar276 = (local_1608[1] - dVar244) - dVar245;
  local_1608[1] = dVar276;
  dVar244 = (dVar244 + local_1608[9]) - dVar245;
  local_1608[9] = dVar244;
  local_1608[10] = dVar245 + local_1608[10];
  local_1358[0] = 0.0;
  local_1358[1] = dVar333 * dVar248 * 111446030.23051862 + 0.0;
  local_1358[6] = 0.0;
  local_1358[7] = 0.0;
  local_1358[4] = 0.0;
  local_1358[5] = 0.0;
  local_1358[2] = 0.0;
  local_1358[3] = 0.0;
  local_1358[8] = 0.0;
  local_1358[9] = dVar248 * 111446030.23051862 * dVar211 + 0.0;
  local_1358[10] = dVar248 * -5.675915683847628 + 0.0;
  local_1358[0xb] = 0.0;
  local_1358[0xc] = 0.0;
  local_1358[0xd] = 0.0;
  local_1358[0xe] = 0.0;
  local_1358[0xf] = 0.0;
  local_1358[0x10] = 0.0;
  local_1358[0x11] = 0.0;
  local_1358[0x12] = 0.0;
  local_1358[0x13] = 0.0;
  local_1358[0x14] = 0.0;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar333 = local_1358[lVar198];
    pdVar184[-9] = pdVar184[-9] - dVar333;
    pdVar184[-1] = pdVar184[-1] - dVar333;
    *pdVar184 = dVar333 + *pdVar184;
    pdVar184 = pdVar184 + 0x16;
  }
  dVar312 = dVar248 * (dVar212 * -37261.015183856354 +
                      (((local_1428 - (dStack_1470 + dStack_1430)) + 1.0) * -0.0006666666666666666 +
                      -0.0003343413408874632) * -5.675915683847628 * local_1548) +
            ((dVar249 * -1.27 + dVar246 * -0.67 + (double)local_1378._0_8_) *
             -0.00011772029828908056 + dVar246 * -0.000995959489983554 +
            -0.000995959489983554 / (dVar312 + 1.0)) * 2.302585092994046 * dVar245;
  pdVar184 = &local_1188;
  local_380._0_8_ = (double)local_380._0_8_ - dVar312;
  local_340 = local_340 - dVar312;
  local_338 = dVar312 + local_338;
  dVar312 = (dVar352 / 39795255.79748703) * 5756549223630996.0;
  dVar211 = dVar211 * local_1538[0xd];
  dVar248 = log10(dVar312);
  local_13c8 = 1.0 / ((dVar248 + -0.1786261669350975) * -0.14 + 1.1696190567051137);
  local_1378._0_8_ = (dVar248 + -0.1786261669350975) * local_13c8;
  local_13b8._0_8_ = 1.0 / ((double)local_1378._0_8_ * (double)local_1378._0_8_ + 1.0);
  dVar248 = pow(10.0,(double)local_13b8._0_8_ * -0.33040870606701866);
  dVar333 = local_1538[0xe];
  dVar249 = local_1538[1];
  dVar212 = (double)local_13b8._0_8_ * -0.6608174121340373 * (double)local_13b8._0_8_ *
            (double)local_1378._0_8_ * local_13c8;
  dVar246 = dVar212 * -1.1696190567051137 * local_13c8;
  local_13c8 = local_1408;
  dVar248 = dVar248 * (dVar312 / (dVar312 + 1.0));
  dVar245 = (dVar211 * 39795255.79748703 + local_1538[0xe] * -367.47982351959547) * dVar248;
  local_1608[0xd] = local_1608[0xd] - dVar245;
  local_1358[0] = 0.0;
  local_1358[1] = dVar277 * dVar248 * 39795255.79748703 + 0.0;
  local_1358[2] = 0.0;
  local_1358[3] = 0.0;
  local_1358[4] = 0.0;
  local_1358[5] = 0.0;
  local_1358[6] = 0.0;
  local_1358[7] = 0.0;
  local_1358[0xc] = 0.0;
  local_1358[8] = 0.0;
  local_1358[9] = 0.0;
  local_1358[10] = 0.0;
  local_1358[0xb] = 0.0;
  local_1358[0xd] = dVar248 * 39795255.79748703 * local_1538[1] + 0.0;
  local_1358[0xe] = dVar248 * -367.47982351959547 + 0.0;
  local_1358[0x13] = 0.0;
  local_1358[0x14] = 0.0;
  local_1358[0x11] = 0.0;
  local_1358[0x12] = 0.0;
  local_1358[0xf] = 0.0;
  local_1358[0x10] = 0.0;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar277 = local_1358[lVar198];
    pdVar184[-0xd] = pdVar184[-0xd] - dVar277;
    pdVar184[-1] = pdVar184[-1] - dVar277;
    *pdVar184 = dVar277 + *pdVar184;
    pdVar184 = pdVar184 + 0x16;
  }
  dVar211 = dVar248 * (dVar211 * 10420.408369112773 +
                      (((local_1408 - (dStack_1410 + dVar278)) + 1.0) * -0.0006666666666666666 +
                      0.0002618505186181212) * -367.47982351959547 * local_1538[0xe]) +
            (((double)local_1378._0_8_ * dVar212 * -1.27 +
             dVar246 * -0.67 + (double)local_13b8._0_8_) * -0.0001220771720522275 +
             dVar246 * -0.0007194001075784557 + -0.0007194001075784557 / (dVar312 + 1.0)) *
            2.302585092994046 * dVar245;
  pdVar184 = local_1180;
  local_380._0_8_ = (double)local_380._0_8_ - dVar211;
  dStack_320 = dStack_320 - dVar211;
  dStack_318 = dVar211 + dStack_318;
  dVar211 = ((local_13a8 * 1e-12) / 6244953.487472275) * 193693058799875.4;
  unique0x10008272 = 0.0;
  local_1378._0_8_ = local_1538[1] * local_1538[0xe];
  local_13a8 = -0.001233681740997213 / (dVar211 + 1.0);
  dVar312 = log10(dVar211);
  local_13b8._0_8_ = 1.0 / ((dVar312 + -0.09427787237484897) * -0.14 + 1.3295031374387192);
  local_1388 = (dVar312 + -0.09427787237484897) * (double)local_13b8._0_8_;
  local_1398._0_8_ = 1.0 / (local_1388 * local_1388 + 1.0);
  dVar312 = pow(10.0,(double)local_1398._0_8_ * -0.4563016830226135);
  dVar248 = (double)local_1398._0_8_ * -0.912603366045227 * (double)local_1398._0_8_ * local_1388 *
            (double)local_13b8._0_8_;
  dVar212 = dVar248 * -1.3295031374387192 * (double)local_13b8._0_8_;
  dVar312 = dVar312 * (dVar211 / (dVar211 + 1.0));
  dVar246 = ((double)local_1378._0_8_ * 6244953.487472275 + local_1538[0xf] * -27501071940.071716) *
            dVar312;
  dVar277 = (dVar276 - dVar245) - dVar246;
  local_1608[1] = dVar277;
  dVar211 = (dVar245 + local_1608[0xe]) - dVar246;
  local_1608[0xe] = dVar211;
  local_1608[0xf] = dVar246 + local_1608[0xf];
  local_1358[0] = 0.0;
  local_1358[1] = dVar312 * 6244953.487472275 * dVar333 + 0.0;
  local_1358[2] = 0.0;
  local_1358[3] = 0.0;
  local_1358[4] = 0.0;
  local_1358[5] = 0.0;
  local_1358[6] = 0.0;
  local_1358[7] = 0.0;
  local_1358[8] = 0.0;
  local_1358[9] = 0.0;
  local_1358[10] = 0.0;
  local_1358[0xb] = 0.0;
  local_1358[0xc] = 0.0;
  local_1358[0xd] = 0.0;
  local_1358[0xe] = dVar312 * 6244953.487472275 * dVar249 + 0.0;
  local_1358[0xf] = dVar312 * -27501071940.071716 + 0.0;
  local_1358[0x10] = 0.0;
  local_1358[0x11] = 0.0;
  local_1358[0x12] = 0.0;
  local_1358[0x13] = 0.0;
  local_1358[0x14] = 0.0;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar245 = local_1358[lVar198];
    pdVar184[-0xe] = pdVar184[-0xe] - dVar245;
    pdVar184[-1] = pdVar184[-1] - dVar245;
    *pdVar184 = dVar245 + *pdVar184;
    pdVar184 = pdVar184 + 0x16;
  }
  dVar312 = dVar312 * ((double)local_1378._0_8_ * 5521.547321046288 +
                      (((dStack_1400 - (dVar278 + local_13c8)) + 1.0) * -0.0006666666666666666 +
                      0.0008841614804854543) * -27501071940.071716 * local_1538[0xf]) +
            ((local_1388 * dVar248 * -1.27 + dVar212 * -0.67 + (double)local_1398._0_8_) *
             -8.975305961941277e-05 + dVar212 * -0.001233681740997213 + local_13a8) *
            2.302585092994046 * dVar246;
  pdVar184 = &local_1170;
  local_380._0_8_ = (double)local_380._0_8_ - dVar312;
  dStack_318 = dStack_318 - dVar312;
  local_310 = dVar312 + local_310;
  local_1378._0_8_ = local_1538[0x10];
  dVar312 = (dVar352 / 16225653.552515732) * 7.275514395950915e+16;
  local_13b8._8_8_ = 0;
  local_13b8._0_8_ = dVar249 * local_1538[0x10];
  local_13a8 = dVar312 / (dVar312 + 1.0);
  dVar248 = log10(dVar312);
  local_1388 = 1.0 / ((dVar248 + -0.015265883794403325) * -0.14 + 1.4792721307180714);
  local_1398._0_8_ = (dVar248 + -0.015265883794403325) * local_1388;
  local_1268 = 1.0 / ((double)local_1398._0_8_ * (double)local_1398._0_8_ + 1.0);
  dVar248 = pow(10.0,local_1268 * -0.5742300241874577);
  dVar246 = dStack_13f0;
  dVar212 = local_1268 * -1.1484600483749154 * local_1268 * (double)local_1398._0_8_ * local_1388;
  local_1388 = dVar212 * -1.4792721307180714 * local_1388;
  dVar248 = dVar248 * local_13a8;
  dVar245 = ((double)local_13b8._0_8_ * 16225653.552515732 + local_1538[0x11] * -67434469.58138922)
            * dVar248;
  local_1608[0x10] = local_1608[0x10] - dVar245;
  local_13a8 = dVar245 + local_1608[0x11];
  dStack_13a0 = (double)local_13b8._8_8_;
  local_1358[0] = 0.0;
  local_1358[1] = (double)local_1378._0_8_ * dVar248 * 16225653.552515732 + 0.0;
  local_1358[2] = 0.0;
  local_1358[3] = 0.0;
  local_1358[4] = 0.0;
  local_1358[5] = 0.0;
  local_1358[6] = 0.0;
  local_1358[7] = 0.0;
  local_1358[8] = 0.0;
  local_1358[9] = 0.0;
  local_1358[10] = 0.0;
  local_1358[0xb] = 0.0;
  local_1358[0xc] = 0.0;
  local_1358[0xd] = 0.0;
  local_1358[0xe] = 0.0;
  local_1358[0xf] = 0.0;
  local_1358[0x10] = dVar248 * 16225653.552515732 * dVar249 + 0.0;
  local_1358[0x11] = dVar248 * -67434469.58138922 + 0.0;
  local_1358[0x12] = 0.0;
  local_1358[0x13] = 0.0;
  local_1358[0x14] = 0.0;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar276 = local_1358[lVar198];
    pdVar184[-0x10] = pdVar184[-0x10] - dVar276;
    pdVar184[-1] = pdVar184[-1] - dVar276;
    *pdVar184 = dVar276 + *pdVar184;
    pdVar184 = pdVar184 + 0x16;
  }
  dVar312 = dVar248 * ((double)local_13b8._0_8_ * 11515.557849353894 +
                      (((dStack_13f0 - (local_13f8 + dVar278)) + 1.0) * -0.0006666666666666666 +
                      0.0007097130363398179) * -67434469.58138922 * local_1538[0x11]) +
            (((double)local_1398._0_8_ * dVar212 * -1.27 + local_1388 * -0.67 + local_1268) *
             -0.00018029438599527205 + local_1388 * -0.0018374389917122033 +
            -0.0018374389917122033 / (dVar312 + 1.0)) * 2.302585092994046 * dVar245;
  pdVar184 = local_1168;
  local_380._0_8_ = (double)local_380._0_8_ - dVar312;
  local_308 = local_308 - dVar312;
  local_300._0_8_ = dVar312 + (double)local_300._0_8_;
  dVar312 = (dVar352 / 219941642.44158944) * 6.888873607161395e+17;
  local_1398._8_8_ = 0;
  local_1398._0_8_ = dVar249 * local_1538[0x11];
  local_13b8._0_8_ = dVar312 / (dVar312 + 1.0);
  local_1388 = -0.001267383041404717 / (dVar312 + 1.0);
  local_1378._0_8_ = local_1538[0x11];
  dVar312 = log10(dVar312);
  local_1268 = 1.0 / ((dVar312 + -0.1601631500988638) * -0.14 + 1.2046161184693178);
  local_1238 = (dVar312 + -0.1601631500988638) * local_1268;
  local_1248 = 1.0 / (local_1238 * local_1238 + 1.0);
  dVar312 = pow(10.0,local_1248 * -0.35796544761363613);
  dVar332 = local_13e8;
  dVar248 = local_1248 * -0.7159308952272723 * local_1248 * local_1238 * local_1268;
  dVar212 = dVar248 * -1.2046161184693178 * local_1268;
  dVar312 = dVar312 * (double)local_13b8._0_8_;
  dVar276 = (local_1398._0_8_ * 219941642.44158944 + dVar247 * -123.84112181745292) * dVar312;
  dVar277 = (dVar277 - dVar245) - dVar276;
  local_1608[1] = dVar277;
  local_1608[0x11] = local_13a8 - dVar276;
  local_1358[0] = 0.0;
  local_1358[1] = (double)local_1378._0_8_ * dVar312 * 219941642.44158944 + 0.0;
  local_1358[0xe] = 0.0;
  local_1358[0xf] = 0.0;
  local_1358[0xc] = 0.0;
  local_1358[0xd] = 0.0;
  local_1358[10] = 0.0;
  local_1358[0xb] = 0.0;
  local_1358[8] = 0.0;
  local_1358[9] = 0.0;
  local_1358[6] = 0.0;
  local_1358[7] = 0.0;
  local_1358[4] = 0.0;
  local_1358[5] = 0.0;
  local_1358[2] = 0.0;
  local_1358[3] = 0.0;
  local_1358[0x10] = 0.0;
  local_1358[0x11] = dVar312 * 219941642.44158944 * dVar249 + 0.0;
  local_1358[0x12] = dVar312 * -123.84112181745292 + 0.0;
  local_1358[0x13] = 0.0;
  local_1358[0x14] = 0.0;
  local_1378._8_4_ = local_1398._8_4_;
  local_1378._0_8_ = dVar276 + local_1608[0x12];
  uStack_136c = local_1398._12_4_;
  local_1608[0x12] = dVar276 + local_1608[0x12];
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar245 = local_1358[lVar198];
    pdVar184[-0x11] = pdVar184[-0x11] - dVar245;
    pdVar184[-1] = pdVar184[-1] - dVar245;
    *pdVar184 = dVar245 + *pdVar184;
    pdVar184 = pdVar184 + 0x16;
  }
  dVar312 = dVar312 * (local_1398._0_8_ * -67440.72224696395 +
                      (((local_13e8 - (dVar246 + dVar278)) + 1.0) * -0.0006666666666666666 +
                      -0.0003066300746793522) * -123.84112181745292 * dVar247) +
            ((local_1238 * dVar248 * -1.27 + dVar212 * -0.67 + local_1248) * -0.00016037027791424038
             + dVar212 * -0.001267383041404717 + local_1388) * 2.302585092994046 * dVar276;
  pdVar184 = &local_1188;
  local_380._0_8_ = (double)local_380._0_8_ - dVar312;
  local_300._8_8_ = dVar312 + (double)local_300._8_8_;
  local_300._0_8_ = (double)local_300._0_8_ - dVar312;
  dVar312 = (dVar352 / 6.312363615626772e-06) * 35752.450724543516;
  local_1388 = local_1558 * dVar213;
  local_13b8._0_8_ = dVar312 / (dVar312 + 1.0);
  local_13a8 = -0.0009631147670810994 / (dVar312 + 1.0);
  dVar312 = log10(dVar312);
  dVar248 = 1.0 / ((dVar312 + -0.09697718965666909) * -0.14 + 1.3243865210985526);
  local_1268 = (dVar312 + -0.09697718965666909) * dVar248;
  local_1238 = 1.0 / (local_1268 * local_1268 + 1.0);
  local_1398._0_8_ = dVar248;
  dVar312 = pow(10.0,local_1238 * -0.45227285125870287);
  dVar246 = local_1538[9];
  dVar248 = local_1238 * -0.9045457025174057 * local_1238 * local_1268 * (double)local_1398._0_8_;
  dVar212 = dVar248 * -1.3243865210985526 * (double)local_1398._0_8_;
  dVar248 = (local_1268 * dVar248 * -1.27 + dVar212 * -0.67 + local_1238) * -0.0002754907583934973 +
            dVar212 * -0.0009631147670810994 + local_13a8;
  local_13a8 = dStack_1420;
  dVar312 = dVar312 * (double)local_13b8._0_8_;
  dVar212 = (local_1388 * 6.312363615626772e-06 + dVar333 * -115.13226896846228) * dVar312;
  local_1608[0] = local_1608[0] - dVar212;
  dVar245 = local_1608[0xb] - dVar212;
  local_1608[0xb] = dVar245;
  local_1608[0xe] = dVar212 + dVar211;
  local_1358[0] = dVar312 * 6.312363615626772e-06 * dVar213 + 0.0;
  local_1358[1] = 0.0;
  local_1358[2] = 0.0;
  local_1358[3] = 0.0;
  local_1358[4] = 0.0;
  local_1358[5] = 0.0;
  local_1358[6] = 0.0;
  local_1358[7] = 0.0;
  local_1358[8] = 0.0;
  local_1358[9] = 0.0;
  local_1358[10] = 0.0;
  local_1358[0xb] = dVar312 * 6.312363615626772e-06 * local_1558 + 0.0;
  local_1358[0xc] = 0.0;
  local_1358[0xd] = 0.0;
  local_1358[0xe] = dVar312 * -115.13226896846228 + 0.0;
  local_1358[0x13] = 0.0;
  local_1358[0x14] = 0.0;
  local_1358[0x11] = 0.0;
  local_1358[0x12] = 0.0;
  local_1358[0xf] = 0.0;
  local_1358[0x10] = 0.0;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar211 = local_1358[lVar198];
    pdVar184[-0xe] = pdVar184[-0xe] - dVar211;
    pdVar184[-3] = pdVar184[-3] - dVar211;
    *pdVar184 = dVar211 + *pdVar184;
    pdVar184 = pdVar184 + 0x16;
  }
  dVar211 = dVar312 * (local_1388 * 1.1868939967403452e-07 +
                      (((local_13c8 - (local_1478 + dStack_1420)) + 1.0) * -0.0006666666666666666 +
                      0.01880268737691365) * -115.13226896846228 * dVar333) +
            dVar248 * 2.302585092994046 * dVar212;
  pdVar184 = &local_11b0;
  local_388 = local_388 - dVar211;
  dStack_330 = dStack_330 - dVar211;
  dStack_318 = dVar211 + dStack_318;
  dVar211 = (dVar352 / 14295380.788738592) * 4.2554035761159823e+18;
  local_13c8 = local_1538[9] * local_1538[9];
  local_1558 = -0.001974975711261012 / (dVar211 + 1.0);
  dVar352 = log10(dVar211);
  local_13b8._0_8_ = 1.0 / ((dVar352 + 0.12973051019251233) * -0.14 + 1.7541160417081951);
  local_1388 = (dVar352 + 0.12973051019251233) * (double)local_13b8._0_8_;
  local_1398._0_8_ = 1.0 / (local_1388 * local_1388 + 1.0);
  dVar352 = pow(10.0,(double)local_1398._0_8_ * -0.7906425525261378);
  dVar312 = (double)local_1398._0_8_ * -1.5812851050522756 * (double)local_1398._0_8_ * local_1388 *
            (double)local_13b8._0_8_;
  dVar248 = dVar312 * -1.7541160417081951 * (double)local_13b8._0_8_;
  dVar352 = dVar352 * (dVar211 / (dVar211 + 1.0));
  dVar211 = (local_13c8 * 14295380.788738592 + dVar247 * -4338.16492800087) * dVar352;
  local_1608[0x12] = (double)local_1378._0_8_ + dVar211;
  local_1608[9] = dVar244 - (dVar211 + dVar211);
  local_1358[0] = 0.0;
  local_1358[1] = 0.0;
  local_1358[2] = 0.0;
  local_1358[3] = 0.0;
  local_1358[4] = 0.0;
  local_1358[5] = 0.0;
  local_1358[6] = 0.0;
  local_1358[7] = 0.0;
  local_1358[8] = 0.0;
  local_1358[9] = (dVar352 * 14295380.788738592 + dVar352 * 14295380.788738592) * dVar246 + 0.0;
  local_1358[0x10] = 0.0;
  local_1358[0x11] = 0.0;
  local_1358[0xe] = 0.0;
  local_1358[0xf] = 0.0;
  local_1358[0xc] = 0.0;
  local_1358[0xd] = 0.0;
  local_1358[10] = 0.0;
  local_1358[0xb] = 0.0;
  local_1358[0x12] = dVar352 * -4338.16492800087 + 0.0;
  local_1358[0x13] = 0.0;
  local_1358[0x14] = 0.0;
  pdVar190 = local_1b8 + 5;
  pdVar193 = local_1b8 + 7;
  pdVar194 = local_1b8 + 9;
  pdVar196 = local_1b8 + 0xb;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar212 = local_1358[lVar198];
    *pdVar184 = *pdVar184 - (dVar212 + dVar212);
    pdVar184[9] = dVar212 + pdVar184[9];
    pdVar184 = pdVar184 + 0x16;
  }
  dVar211 = dVar352 * (local_13c8 * -7262.089447255807 +
                      (((dVar332 - (local_12a8 + local_12a8)) + 1.0) * -0.0006666666666666666 +
                      -0.0005080025187560327) * -4338.16492800087 * dVar247) +
            ((local_1388 * dVar312 * -1.27 + dVar248 * -0.67 + (double)local_1398._0_8_) *
             -0.00010911464158415095 + dVar248 * -0.001974975711261012 + local_1558) *
            2.302585092994046 * dVar211;
  pauVar185 = (undefined1 (*) [16])&local_11f0;
  local_340 = local_340 - (dVar211 + dVar211);
  local_300._8_8_ = dVar211 + (double)local_300._8_8_;
  local_1358[3] =
       dVar249 * local_1538[2] * 333.3333333333333 + local_1538[4] * -7.276980120178465e-07;
  dVar211 = (double)local_1228._0_8_ * local_1358[3];
  local_1608[1] = dVar277 - dVar211;
  local_1608[2] = local_1608[2] - dVar211;
  dVar211 = dVar211 + local_1608[4];
  local_1608[4] = dVar211;
  local_1358[1] = local_1538[2] * (double)local_1228._0_8_ * 333.3333333333333 + local_1358[3];
  local_1358[2] = dVar249 * (double)local_1228._0_8_ * 333.3333333333333 + local_1358[3];
  local_1358[4] = (double)local_1228._0_8_ * -7.276980120178465e-07 + local_1358[3];
  local_1358[5] = local_1358[3] * 6.0;
  local_1358[8] = local_1358[3];
  local_1358[9] = local_1358[3];
  local_1358[6] = local_1358[3];
  local_1358[7] = local_1358[3];
  local_1358[0] = local_1358[3] * 2.0;
  auVar119._8_4_ = SUB84(local_1358[3] * 1.5,0);
  auVar119._0_8_ = local_1358[0];
  auVar119._12_4_ = (int)((ulong)(local_1358[3] * 1.5) >> 0x20);
  local_1358[10] = local_1358[0];
  local_1358[0xb] = auVar119._8_8_;
  local_1358[0xc] = local_1358[0];
  local_1358[0xf] = local_1358[3];
  local_1358[0x10] = local_1358[3];
  local_1358[0xd] = local_1358[3];
  local_1358[0xe] = local_1358[3];
  local_1358[0x11] = local_1358[3];
  local_1358[0x12] = local_1358[3] * 3.0;
  local_1358[0x13] = local_1358[3];
  local_1358[0x14] = local_1358[3] * 0.7;
  pdVar184 = local_1b8 + 0xd;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar352 = local_1358[lVar198];
    dVar312 = *(double *)(*pauVar185 + 8) - dVar352;
    auVar120._8_4_ = SUB84(dVar312,0);
    auVar120._0_8_ = *(double *)*pauVar185 - dVar352;
    auVar120._12_4_ = (int)((ulong)dVar312 >> 0x20);
    *pauVar185 = auVar120;
    *(double *)(pauVar185[1] + 8) = dVar352 + *(double *)(pauVar185[1] + 8);
    pauVar185 = pauVar185 + 0xb;
  }
  local_1228._0_8_ =
       (double)local_1228._0_8_ *
       (dVar249 * local_1538[2] * -0.2222222222222222 +
       (((local_1458 - (dVar278 + local_1468)) + 1.0) * -0.0006666666666666666 +
       -0.0006666666666666666) * -7.276980120178465e-07 * local_1538[4]);
  pdVar186 = &local_1198;
  auVar30._8_4_ = SUB84((double)local_380._8_8_ - (double)local_1228._0_8_,0);
  auVar30._0_8_ = (double)local_380._0_8_ - (double)local_1228._0_8_;
  auVar30._12_4_ = (int)((ulong)((double)local_380._8_8_ - (double)local_1228._0_8_) >> 0x20);
  local_380 = auVar30;
  dStack_368 = (double)local_1228._0_8_ + dStack_368;
  dVar352 = local_1488 * -0.5 +
            local_1298 +
            local_1368 * 2.5 +
            dVar213 * 0.5 +
            local_1288 * 5.0 + local_1538[3] * 5.0 + (double)local_1258._0_8_ + local_1548;
  local_1358[1] = local_1538[2] * dVar213 * 220.0432490668822 + local_1368 * -3.54614235835121e-08;
  dVar312 = local_1358[1] * dVar352;
  local_1608[2] = local_1608[2] - dVar312;
  local_1608[0xb] = dVar245 - dVar312;
  local_1608[0xc] = dVar312 + local_1608[0xc];
  local_1358[0] = local_1358[1] + local_1358[1];
  local_1358[2] = dVar352 * 220.0432490668822 * dVar213 + local_1358[1];
  local_1358[3] = local_1358[1] * 6.0;
  local_1358[4] = local_1358[1];
  local_1358[5] = local_1358[1] * 6.0;
  uVar203 = SUB84(local_1358[1],0);
  uVar204 = (undefined4)((ulong)local_1358[1] >> 0x20);
  auVar150._8_4_ = uVar203;
  auVar150._0_8_ = local_1358[1];
  auVar150._12_4_ = uVar204;
  local_1358[8] = local_1358[1];
  local_1358[9] = auVar150._8_8_;
  auVar151._8_4_ = uVar203;
  auVar151._0_8_ = local_1358[1];
  auVar151._12_4_ = uVar204;
  local_1358[6] = local_1358[1];
  local_1358[7] = auVar151._8_8_;
  local_1358[10] = local_1358[1] + local_1358[1];
  local_1358[0xb] = local_1358[1] * 1.5 + local_1538[2] * dVar352 * 220.0432490668822;
  local_1358[0xc] = local_1358[1] * 3.5 + dVar352 * -3.54614235835121e-08;
  auVar152._8_4_ = uVar203;
  auVar152._0_8_ = local_1358[1];
  auVar152._12_4_ = uVar204;
  local_1358[0xf] = local_1358[1];
  local_1358[0x10] = auVar152._8_8_;
  auVar153._8_4_ = uVar203;
  auVar153._0_8_ = local_1358[1];
  auVar153._12_4_ = uVar204;
  local_1358[0xd] = local_1358[1];
  local_1358[0xe] = auVar153._8_8_;
  local_1358[0x11] = local_1358[1];
  local_1358[0x12] = local_1358[1] * 3.0;
  local_1358[0x13] = local_1358[1];
  local_1358[0x14] = local_1358[1] * 0.5;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar312 = local_1358[lVar198];
    pdVar186[-10] = pdVar186[-10] - dVar312;
    pdVar186[-1] = pdVar186[-1] - dVar312;
    *pdVar186 = dVar312 + *pdVar186;
    pdVar186 = pdVar186 + 0x16;
  }
  dVar352 = dVar352 * (local_1538[2] * dVar213 * 0.14763924017103203 +
                      (((local_1418 - (local_1468 + local_13a8)) + 1.0) * -0.0006666666666666666 +
                      0.0006709555544062933) * -3.54614235835121e-08 * local_1368);
  pdVar186 = &local_11f0;
  local_380._8_8_ = (double)local_380._8_8_ - dVar352;
  dStack_330 = dStack_330 - dVar352;
  dStack_328 = dVar352 + dStack_328;
  local_1488 = ((dVar247 * 0.5 +
                local_1368 * 0.5 + dVar213 * -0.25 + ((dVar267 - local_1538[3]) - local_1288)) -
               local_1538[0x13]) - local_1488;
  dVar312 = local_1538[3] * dVar249;
  local_1358[0] = dVar312 * 5196.603105918946 + local_1538[6] * -515.2276090538855;
  uVar203 = SUB84(local_1358[0],0);
  uVar204 = (undefined4)((ulong)local_1358[0] >> 0x20);
  local_1358[1] = local_1488 * 5196.603105918946 * local_1538[3] + local_1358[0];
  local_1358[2] = local_1358[0];
  local_1358[3] = local_1488 * 5196.603105918946 * dVar249;
  local_1358[4] = local_1358[0];
  local_1358[5] = 0.0;
  local_1358[6] = local_1488 * -515.2276090538855 + local_1358[0];
  auVar77._8_4_ = uVar203;
  auVar77._0_8_ = local_1358[0];
  auVar77._12_4_ = uVar204;
  local_1358[9] = local_1358[0];
  local_1358[10] = auVar77._8_8_;
  auVar78._8_4_ = uVar203;
  auVar78._0_8_ = local_1358[0];
  auVar78._12_4_ = uVar204;
  local_1358[7] = local_1358[0];
  local_1358[8] = auVar78._8_8_;
  local_1358[0xb] = local_1358[0] * 0.75;
  local_1358[0xc] = local_1358[0] * 1.5;
  auVar79._8_4_ = uVar203;
  auVar79._0_8_ = local_1358[0];
  auVar79._12_4_ = uVar204;
  local_1358[0xf] = local_1358[0];
  local_1358[0x10] = auVar79._8_8_;
  auVar80._8_4_ = uVar203;
  auVar80._0_8_ = local_1358[0];
  auVar80._12_4_ = uVar204;
  local_1358[0xd] = local_1358[0];
  local_1358[0xe] = auVar80._8_8_;
  dVar352 = local_1488 * local_1358[0];
  local_1358[0x11] = local_1358[0];
  local_1608[1] = local_1608[1] - dVar352;
  local_1358[0x12] = local_1358[0] * 1.5;
  local_1358[0x13] = 0.0;
  local_1358[0x14] = 0.0;
  local_1608[3] = local_1608[3] - dVar352;
  local_1608[6] = dVar352 + local_1608[6];
  pdVar197 = local_1b8 + 0xf;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar352 = local_1358[lVar198];
    *pdVar186 = *pdVar186 - dVar352;
    pdVar186[2] = pdVar186[2] - dVar352;
    pdVar186[5] = dVar352 + pdVar186[5];
    pdVar186 = pdVar186 + 0x16;
  }
  local_1488 = local_1488 *
               (dVar312 * -2.979385780726863 +
               (((local_1448 - (dVar278 + dStack_1460)) + 1.0) * -0.0006666666666666666 +
               -0.0005733333333333334) * -515.2276090538855 * local_1538[6]);
  dVar352 = local_1538[3] * local_1538[3] * dVar249;
  dVar247 = dVar352 * 1033.3424938946343 + local_1538[3] * local_1538[6] * -102.45280842339088;
  dVar353 = dVar352 * -1.1848993929991807 +
            ((((dStack_1460 + local_1448) - (dStack_1460 + dStack_1460 + dVar278)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -102.45280842339088 *
            local_1538[3] * local_1538[6];
  pdVar186 = &local_11f0;
  dVar333 = local_1538[3] * local_1538[3] * 1033.3424938946343;
  dVar362 = (dVar249 * 1033.3424938946343 + dVar249 * 1033.3424938946343) * local_1538[3] +
            local_1538[6] * -102.45280842339088;
  dVar248 = local_1538[3] * -102.45280842339088;
  dVar332 = dVar312 * local_1288 * 36172.079901627476 +
            local_1538[6] * local_1288 * -3586.3532123502373;
  dVar212 = dVar312 * local_1288 * -18.327187150157922 +
            ((((dStack_1450 + local_1448) - (dVar278 + dStack_1460 + dStack_1450)) + 1.0) *
             -0.0006666666666666666 + -0.0005066666666666667) * -3586.3532123502373 *
            local_1538[6] * local_1288;
  dVar213 = local_1538[3] * 36172.079901627476 * local_1538[5];
  dVar276 = local_1538[5] * local_1538[1] * 36172.079901627476;
  dVar352 = local_1538[1] * 36172.079901627476 * local_1538[3] + local_1538[6] * -3586.3532123502373
  ;
  local_e80 = local_e80 - dVar352;
  dStack_e70 = dStack_e70 - dVar352;
  local_e58 = dVar352 + local_e58;
  dVar244 = local_1538[5] * -3586.3532123502373;
  dVar352 = local_1538[3] * local_1538[1] * local_1538[0x13];
  dVar249 = dVar352 * 1291.6781173682928 + local_1538[6] * local_1538[0x13] * -128.06601052923858;
  dVar278 = dVar352 * -1.4811242412489758 +
            ((((dStack_13e0 + local_1448) - (dStack_1470 + dStack_1460 + dStack_13e0)) + 1.0) *
             -0.0006666666666666666 + -0.0011466666666666667) * -128.06601052923858 *
            local_1538[6] * local_1538[0x13];
  dVar245 = local_1538[0x13] * local_1538[1] * 1291.6781173682928;
  dVar246 = local_1538[3] * 1291.6781173682928 * local_1538[0x13];
  dVar371 = local_1538[0x13] * -128.06601052923858;
  dVar352 = local_1538[1] * 1291.6781173682928 * local_1538[3] + local_1538[6] * -128.06601052923858
  ;
  local_4e0 = local_4e0 - dVar352;
  local_4d0 = local_4d0 - dVar352;
  local_4b8 = dVar352 + local_4b8;
  dVar312 = local_1538[3] * local_1538[1] * local_1538[0x14];
  dVar352 = dVar312 * 2014.7679457577242 + local_1538[6] * local_1538[0x14] * -199.75819787137542;
  dVar312 = dVar312 * -1.0745429044041197 +
            ((((local_13d8 + local_1448) - (dStack_1470 + dStack_1460 + local_13d8)) + 1.0) *
             -0.0006666666666666666 + -0.0005333333333333334) * -199.75819787137542 *
            local_1538[6] * local_1538[0x14];
  local_1608[3] = (((local_1608[3] - dVar247) - dVar332) - dVar249) - dVar352;
  local_1608[6] = dVar352 + dVar249 + dVar332 + dVar247 + local_1608[6];
  dVar277 = local_1538[3] * 2014.7679457577242 * local_1538[0x14];
  adStack_1150[2] = (((adStack_1150[2] - dVar333) - dVar213) - dVar246) - dVar277;
  adStack_1150[4] = (((adStack_1150[4] - dVar333) - dVar213) - dVar246) - dVar277;
  adStack_1150[7] = dVar277 + dVar246 + dVar213 + dVar333 + adStack_1150[7];
  dVar246 = local_1538[0x14] * local_1538[1] * 2014.7679457577242;
  local_fe0 = (((local_fe0 - dVar362) - dVar276) - dVar245) - dVar246;
  dStack_fd0 = (((dStack_fd0 - dVar362) - dVar276) - dVar245) - dVar246;
  dStack_fb8 = dVar246 + dVar245 + dVar276 + dVar362 + dStack_fb8;
  dVar246 = local_1538[0x14] * -199.75819787137542;
  local_dd0 = (((local_dd0 - dVar248) - dVar244) - dVar371) - dVar246;
  local_dc0 = (((local_dc0 - dVar248) - dVar244) - dVar371) - dVar246;
  dStack_da8 = dVar246 + dVar371 + dVar244 + dVar248 + dStack_da8;
  dVar248 = local_1538[1] * 2014.7679457577242 * local_1538[3] + local_1538[6] * -199.75819787137542
  ;
  local_430 = local_430 - dVar248;
  local_420 = local_420 - dVar248;
  local_408 = dVar248 + local_408;
  local_380._0_8_ =
       (((((double)local_380._0_8_ - local_1488) - dVar353) - dVar212) - dVar278) - dVar312;
  local_370 = ((((local_370 - local_1488) - dVar353) - dVar212) - dVar278) - dVar312;
  local_358 = dVar312 + dVar278 + dVar212 + dVar353 + local_1488 + local_358;
  dVar212 = local_1538[0x14] * -0.37 +
            local_1538[0x12] + local_1538[0x12] +
            ((((dVar267 - local_1538[0]) - local_1538[5]) + local_1538[10]) - local_1538[0xc]);
  dVar312 = local_1538[1] * local_1538[1];
  dVar248 = dStack_1470 + dStack_1470;
  local_1358[2] = dVar312 * 666.6666666666666 + local_1538[0] * -1.6792101947629015e-06;
  dVar246 = local_1358[2] * dVar212;
  local_1608[0] = local_1608[0] + dVar246;
  local_1608[1] =
       ((((local_1608[1] - dVar247) - dVar332) - dVar249) - dVar352) - (dVar246 + dVar246);
  local_1358[0] = dVar212 * -1.6792101947629015e-06;
  local_1358[1] =
       (dVar212 * 666.6666666666666 + dVar212 * 666.6666666666666) * local_1538[1] + local_1358[2];
  local_1358[3] = local_1358[2];
  local_1358[4] = local_1358[2];
  local_1358[5] = 0.0;
  local_1358[8] = local_1358[2];
  local_1358[9] = local_1358[2];
  local_1358[6] = local_1358[2];
  local_1358[7] = local_1358[2];
  local_1358[10] = local_1358[2] + local_1358[2];
  local_1358[0xb] = local_1358[2];
  local_1358[0xc] = 0.0;
  local_1358[0xf] = local_1358[2];
  local_1358[0x10] = local_1358[2];
  local_1358[0xd] = local_1358[2];
  local_1358[0xe] = local_1358[2];
  local_1358[0x11] = local_1358[2];
  local_1358[0x12] = local_1358[2] * 3.0;
  local_1358[0x13] = local_1358[2];
  local_1358[0x14] = local_1358[2] * 0.63;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar352 = local_1358[lVar198];
    pdVar186[-1] = pdVar186[-1] + dVar352;
    *pdVar186 = *pdVar186 - (dVar352 + dVar352);
    pdVar186 = pdVar186 + 0x16;
  }
  dVar212 = dVar212 * (dVar312 * -0.4444444444444444 +
                      (((local_1478 - dVar248) + 1.0) * -0.0006666666666666666 +
                      -0.0006666666666666666) * -1.6792101947629015e-06 * local_1538[0]);
  pdVar186 = &local_11d0;
  dVar333 = dVar312 * local_1538[0] * 1118.3757819574057 +
            local_1538[0] * local_1538[0] * -2.8169820219582113e-06;
  dVar247 = dVar312 * local_1538[0] * -0.4473503127829622 +
            (-0.00039999999999999996 -
            (((local_1478 + local_1478) - (dVar248 + local_1478)) + 1.0) * 0.0006666666666666666) *
            -2.8169820219582113e-06 * local_1538[0] * local_1538[0];
  dVar213 = dVar312 * 1118.3757819574057 + local_1538[0] * -5.633964043916423e-06;
  dVar277 = (local_1538[0] * 1118.3757819574057 + local_1538[0] * 1118.3757819574057) *
            local_1538[1];
  dVar244 = dVar312 * local_1538[5] * 6427.427351557215 +
            local_1538[0] * local_1538[5] * -1.618950230224919e-05;
  dVar352 = dVar312 * local_1538[5] * -5.356189459631012 +
            (-0.0008333333333333333 -
            (((dStack_1450 + local_1478) - (dVar248 + dStack_1450)) + 1.0) * 0.0006666666666666666)
            * -1.618950230224919e-05 * local_1538[0] * local_1538[5];
  dVar278 = local_1538[5] * -1.618950230224919e-05;
  dVar246 = local_1538[1] * 12854.85470311443 * local_1538[5];
  dVar249 = dVar312 * 6427.427351557215 + local_1538[0] * -1.618950230224919e-05;
  local_e88 = local_e88 + dVar249;
  local_e80 = local_e80 - (dVar249 + dVar249);
  dVar245 = dVar312 * local_1538[0xc] * 244.44444444444443 +
            local_1538[0] * local_1538[0xc] * -6.157104047463972e-07;
  dVar248 = dVar312 * local_1538[0xc] * -0.3259259259259259 +
            (-0.0013333333333333333 -
            (((local_1418 + local_1478) - (dVar248 + local_1418)) + 1.0) * 0.0006666666666666666) *
            -6.157104047463972e-07 * local_1538[0] * local_1538[0xc];
  local_1608[0] = local_1608[0] + dVar333 + dVar244 + dVar245;
  dVar249 = local_1538[1] * 488.88888888888886 * local_1538[0xc];
  dVar312 = local_1538[0xc] * -6.157104047463972e-07;
  local_11f8 = local_11f8 + dVar213 + dVar278 + dVar312;
  local_11f0 = ((local_11f0 - (dVar213 + dVar213)) - (dVar278 + dVar278)) - (dVar312 + dVar312);
  adStack_1150[1] = adStack_1150[1] + dVar277 + dVar246 + dVar249;
  adStack_1150[2] =
       ((adStack_1150[2] - (dVar277 + dVar277)) - (dVar246 + dVar246)) - (dVar249 + dVar249);
  dVar312 = local_1538[1] * local_1538[1] * 244.44444444444443 +
            local_1538[0] * -6.157104047463972e-07;
  local_9b8 = local_9b8 + dVar312;
  local_9b0 = local_9b0 - (dVar312 + dVar312);
  local_388 = local_388 + dVar212 + dVar247 + dVar352 + dVar248;
  local_380._0_8_ =
       ((((double)local_380._0_8_ - (dVar212 + dVar212)) - (dVar247 + dVar247)) -
       (dVar352 + dVar352)) - (dVar248 + dVar248);
  dVar312 = local_1538[0x14] * -0.62 +
            local_1538[0x12] + local_1538[0x12] +
            local_1538[5] * 2.65 + local_1538[0] * -0.27 + dVar267 + local_1538[10];
  local_1358[2] =
       local_1538[1] * local_1538[4] * 9777.777777777777 + local_1538[5] * -7.029234294042697e-07;
  uVar203 = SUB84(local_1358[2],0);
  uVar204 = (undefined4)((ulong)local_1358[2] >> 0x20);
  dVar352 = dVar312 * local_1358[2];
  local_1608[1] =
       (((local_1608[1] - (dVar333 + dVar333)) - (dVar244 + dVar244)) - (dVar245 + dVar245)) -
       dVar352;
  local_1608[4] = dVar211 - dVar352;
  local_1608[5] = dVar352 + local_1608[5];
  local_1358[0] = local_1358[2] * 0.73;
  local_1358[1] = local_1538[4] * dVar312 * 9777.777777777777 + local_1358[2];
  local_1358[3] = local_1358[2];
  local_1358[4] = local_1358[2] + local_1538[1] * dVar312 * 9777.777777777777;
  local_1358[5] = dVar312 * -7.029234294042697e-07 + local_1358[2] * 3.65;
  auVar81._8_4_ = uVar203;
  auVar81._0_8_ = local_1358[2];
  auVar81._12_4_ = uVar204;
  local_1358[8] = local_1358[2];
  local_1358[9] = auVar81._8_8_;
  auVar82._8_4_ = uVar203;
  auVar82._0_8_ = local_1358[2];
  auVar82._12_4_ = uVar204;
  local_1358[6] = local_1358[2];
  local_1358[7] = auVar82._8_8_;
  local_1358[10] = local_1358[2] + local_1358[2];
  auVar83._8_4_ = uVar203;
  auVar83._0_8_ = local_1358[2];
  auVar83._12_4_ = uVar204;
  local_1358[0xd] = local_1358[2];
  local_1358[0xe] = auVar83._8_8_;
  auVar84._8_4_ = uVar203;
  auVar84._0_8_ = local_1358[2];
  auVar84._12_4_ = uVar204;
  local_1358[0xb] = local_1358[2];
  local_1358[0xc] = auVar84._8_8_;
  local_1358[0xf] = local_1358[2];
  local_1358[0x10] = local_1358[2];
  local_1358[0x11] = local_1358[2];
  local_1358[0x12] = local_1358[2] * 3.0;
  local_1358[0x13] = local_1358[2];
  local_1358[0x14] = local_1358[2] * 0.38;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar248 = local_1358[lVar198];
    pdVar186[-4] = pdVar186[-4] - dVar248;
    pdVar186[-1] = pdVar186[-1] - dVar248;
    *pdVar186 = dVar248 + *pdVar186;
    pdVar186 = pdVar186 + 0x16;
  }
  dVar312 = dVar312 * (local_1538[1] * local_1538[4] * -13.037037037037036 +
                      (-0.0013333333333333333 -
                      ((dStack_1450 - (local_1458 + dStack_1470)) + 1.0) * 0.0006666666666666666) *
                      -7.029234294042697e-07 * local_1538[5]);
  pdVar186 = &local_1190;
  dStack_368 = dStack_368 - dVar312;
  local_360 = dVar312 + local_360;
  dVar248 = local_1538[1] * local_1538[5] * local_1538[0xb];
  dVar246 = local_1538[5] * local_1538[0xd] * 4989960.261382571 + dVar248 * -1002.9930150071424;
  dVar248 = local_1538[5] * local_1538[0xd] * 15645.595296379073 +
            (0.0031354148083023287 -
            (((dStack_1470 + dStack_1450 + dStack_1420) - (dStack_1450 + dStack_1410)) + -1.0) *
            0.0006666666666666666) * -1002.9930150071424 * dVar248;
  dVar212 = local_1538[5] * -1002.9930150071424 * local_1538[0xb];
  adStack_1150[2] = adStack_1150[2] + dVar212;
  adStack_1150[0xc] = adStack_1150[0xc] + dVar212;
  adStack_1150[0xe] = adStack_1150[0xe] - dVar212;
  dVar212 = local_1538[0xd] * 4989960.261382571 +
            local_1538[0xb] * local_1538[1] * -1002.9930150071424;
  local_e80 = local_e80 + dVar212;
  local_e30 = local_e30 + dVar212;
  local_e20 = local_e20 - dVar212;
  dVar212 = local_1538[1] * -1002.9930150071424 * local_1538[5];
  local_a60 = local_a60 + dVar212;
  dStack_a10 = dStack_a10 + dVar212;
  dStack_a00 = dStack_a00 - dVar212;
  dVar212 = local_1538[5] * 4989960.261382571;
  local_900 = local_900 + dVar212;
  dStack_8b0 = dStack_8b0 + dVar212;
  local_8a0 = local_8a0 - dVar212;
  local_380._0_8_ = ((double)local_380._0_8_ - dVar312) + dVar248;
  dStack_330 = dStack_330 + dVar248;
  dStack_320 = dStack_320 - dVar248;
  dVar267 = local_1538[0x12] + local_1538[0x12] +
            local_1538[0xb] * 0.5 + ((dVar267 + local_1538[0]) - local_1538[5]) + local_1538[10] +
            local_1538[0xc];
  local_1358[2] =
       local_1538[0xd] * 415830.02178188093 + local_1538[0xb] * local_1538[1] * -83.5827512505952;
  local_1358[0] = local_1358[2] + local_1358[2];
  local_1358[1] = local_1538[0xb] * dVar267 * -83.5827512505952 + local_1358[2];
  local_1358[3] = local_1358[2];
  local_1358[4] = local_1358[2];
  local_1358[5] = 0.0;
  uVar203 = SUB84(local_1358[2],0);
  uVar204 = (undefined4)((ulong)local_1358[2] >> 0x20);
  auVar154._8_4_ = uVar203;
  auVar154._0_8_ = local_1358[2];
  auVar154._12_4_ = uVar204;
  local_1358[8] = local_1358[2];
  local_1358[9] = auVar154._8_8_;
  auVar155._8_4_ = uVar203;
  auVar155._0_8_ = local_1358[2];
  auVar155._12_4_ = uVar204;
  local_1358[6] = local_1358[2];
  local_1358[7] = auVar155._8_8_;
  local_1358[10] = local_1358[0];
  local_1358[0xb] = local_1358[2] * 1.5 + dVar267 * -83.5827512505952 * local_1538[1];
  local_1358[0xc] = local_1358[0];
  local_1358[0xd] = dVar267 * 415830.02178188093 + local_1358[2];
  auVar156._8_4_ = uVar203;
  auVar156._0_8_ = local_1358[2];
  auVar156._12_4_ = uVar204;
  local_1358[0x10] = local_1358[2];
  local_1358[0x11] = auVar156._8_8_;
  auVar157._8_4_ = uVar203;
  auVar157._0_8_ = local_1358[2];
  auVar157._12_4_ = uVar204;
  local_1358[0xe] = local_1358[2];
  local_1358[0xf] = auVar157._8_8_;
  local_1358[0x12] = local_1358[2] * 3.0;
  local_1358[0x13] = local_1358[2];
  local_1358[0x14] = local_1358[2];
  local_1358[2] = local_1358[2] * dVar267;
  local_1608[1] = local_1608[1] + dVar246 + local_1358[2];
  local_1608[0xb] = local_1608[0xb] + dVar246 + local_1358[2];
  local_1608[0xd] = (local_1608[0xd] - dVar246) - local_1358[2];
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar312 = local_1358[lVar198];
    pdVar186[-0xc] = pdVar186[-0xc] + dVar312;
    pdVar186[-2] = pdVar186[-2] + dVar312;
    *pdVar186 = *pdVar186 - dVar312;
    pdVar186 = pdVar186 + 0x16;
  }
  dVar267 = dVar267 * (local_1538[0xd] * 1303.7996080315893 +
                      (0.0031354148083023287 -
                      (((dStack_1420 + dStack_1470) - dStack_1410) + -1.0) * 0.0006666666666666666)
                      * -83.5827512505952 * local_1538[0xb] * local_1538[1]);
  dVar289 = local_1538[0] * local_1538[2] * 1831069.794862108 +
            local_1538[1] * local_1538[4] * -1587014.959464585;
  dVar250 = local_1538[2] * 1831069.794862108;
  dStack_11e8 = dStack_11e8 - dVar250;
  dVar92 = local_1538[0] * local_1538[2] * 5835.198557030137 +
           (0.0031867701457385282 -
           ((dStack_1470 + local_1458) - (local_1478 + local_1468)) * 0.0006666666666666666) *
           -1587014.959464585 * local_1538[1] * local_1538[4];
  dVar251 = local_1538[4] * -1587014.959464585;
  dVar129 = local_1538[0] * 1831069.794862108;
  adStack_1150[0x17] = adStack_1150[0x17] - dVar129;
  dVar312 = local_1538[1] * -1587014.959464585;
  dVar291 = local_1538[4] * -0.44037520695372745;
  dVar252 = local_1538[3] * -0.44037520695372745;
  dVar248 = dVar252 + dVar312 + dStack_f18;
  auVar1._8_4_ = SUB84(dVar248,0);
  auVar1._0_8_ = dVar252 + local_f20;
  auVar1._12_4_ = (int)((ulong)dVar248 >> 0x20);
  dVar248 = local_1538[2] * 20000000.0;
  local_dc8 = local_dc8 - dVar248;
  auVar121._8_4_ = SUB84(dVar248 + dStack_db8,0);
  auVar121._0_8_ = dVar248 + local_dc0;
  auVar121._12_4_ = (int)((ulong)(dVar248 + dStack_db8) >> 0x20);
  dVar212 = local_1538[6] * 20000000.0;
  dVar22 = local_1538[7] * 80000000.0;
  dVar246 = dVar212 + dVar129 + adStack_1150[0x1b];
  auVar31._8_4_ = SUB84(dVar246,0);
  auVar31._0_8_ = dVar212 + adStack_1150[0x1a];
  auVar31._12_4_ = (int)((ulong)dVar246 >> 0x20);
  auVar32._8_4_ = SUB84((double)local_1068._8_8_ - dVar22,0);
  auVar32._0_8_ = (double)local_1068._0_8_ - dVar212;
  auVar32._12_4_ = (int)((ulong)((double)local_1068._8_8_ - dVar22) >> 0x20);
  local_1068 = auVar32;
  dVar288 = local_1538[2] * 80000000.0;
  local_d18 = local_d18 - dVar288;
  dVar50 = local_1538[1] * -2.787694465907913e-05;
  dVar354 = local_1538[0xd] * -2.787694465907913e-05;
  dVar361 = local_1538[0xd] * -1.2126178147109573e-07;
  auVar2._8_4_ = SUB84(adStack_1150[9] - dVar361,0);
  auVar2._0_8_ = adStack_1150[8] - dVar354;
  auVar2._12_4_ = (int)((ulong)(adStack_1150[9] - dVar361) >> 0x20);
  adStack_1150[9] = auVar2._8_8_;
  dVar214 = local_1538[8] * 15000000.0;
  local_1058 = local_1058 - dVar214;
  dVar246 = local_1538[2] * 15000000.0;
  local_c68 = local_c68 - dVar246;
  local_c10 = dVar246 + local_c10;
  dVar249 = local_1538[1] * -1.2126178147109573e-07;
  local_8c8 = local_8c8 - dVar249;
  dVar213 = local_1538[0xd] * local_1538[1];
  dVar277 = local_1538[0xe] * -0.12993945039280527;
  dVar278 = local_1538[9] * 84300000.0;
  dVar51 = local_1538[2] * 84300000.0;
  dVar215 = local_1538[1] * -0.12993945039280527;
  dVar52 = local_1538[2] * local_1538[6] * 20000000.0 +
           local_1538[4] * local_1538[3] * -0.44037520695372745;
  dVar72 = local_1538[2] * local_1538[7] * 80000000.0 + dVar213 * -2.787694465907913e-05;
  dVar292 = local_1538[2] * local_1538[6] * 0.0 +
            (0.0 - ((local_1458 + dStack_1460) - (local_1468 + local_1448)) * 0.0006666666666666666)
            * -0.44037520695372745 * local_1538[4] * local_1538[3];
  dVar302 = local_1538[2] * local_1538[7] * 0.0 +
            (0.0 - ((dStack_1410 + dStack_1470) - (local_1468 + dStack_1440)) *
                   0.0006666666666666666) * -2.787694465907913e-05 * dVar213;
  dVar333 = dVar292 + dVar92 + dStack_368;
  auVar3._8_4_ = SUB84(dVar333,0);
  auVar3._0_8_ = dVar292 + local_370;
  auVar3._12_4_ = (int)((ulong)dVar333 >> 0x20);
  dVar211 = dVar52 + dVar289 + (dVar211 - dVar352);
  auVar33._8_4_ = SUB84(dVar211,0);
  auVar33._0_8_ = dVar52 + local_1608[3];
  auVar33._12_4_ = (int)((ulong)dVar211 >> 0x20);
  auVar85._8_4_ = SUB84(dStack_350 - dVar302,0);
  auVar85._0_8_ = local_358 - dVar292;
  auVar85._12_4_ = (int)((ulong)(dStack_350 - dVar302) >> 0x20);
  dStack_350 = auVar85._8_8_;
  dVar93 = local_1538[2] * local_1538[8] * 0.0 +
           (0.0 - ((dStack_1470 + dStack_1410) - (local_1468 + local_1438)) * 0.0006666666666666666)
           * -1.2126178147109573e-07 * dVar213;
  dVar113 = local_1538[9] * local_1538[2] * 0.0 +
            (0.0 - ((dStack_1470 + local_1408) - (local_1468 + dStack_1430)) * 0.0006666666666666666
            ) * -0.12993945039280527 * local_1538[1] * local_1538[0xe];
  dVar363 = local_1538[2] * local_1538[8] * 15000000.0 + dVar213 * -1.2126178147109573e-07;
  dVar369 = local_1538[9] * local_1538[2] * 84300000.0 +
            local_1538[1] * local_1538[0xe] * -0.12993945039280527;
  dVar94 = dVar93 + (dStack_320 - dVar267) + dVar302;
  auVar86._8_4_ = SUB84(dVar113 + dStack_318,0);
  auVar86._0_8_ = dVar94;
  auVar86._12_4_ = (int)((ulong)(dVar113 + dStack_318) >> 0x20);
  dStack_318 = auVar86._8_8_;
  dVar174 = local_1538[2] * local_1538[10] * 3309407.0851908242 +
            local_1538[4] * local_1538[9] * -141857.17388911778;
  dVar216 = local_1538[2] * local_1538[10] * 9674.740273245088 +
            (0.002923405922631374 -
            ((dStack_1430 + local_1458) - (local_1428 + local_1468)) * 0.0006666666666666666) *
            -141857.17388911778 * local_1538[4] * local_1538[9];
  local_1608[4] = auVar33._8_8_;
  dVar293 = local_1538[9] * -141857.17388911778;
  adStack_1150[0x1b] = auVar31._8_8_;
  dStack_f18 = auVar1._8_8_;
  dVar279 = local_1538[4] * -141857.17388911778;
  dVar253 = local_1538[2] * 3309407.0851908242;
  local_b08 = local_b08 - dVar253;
  dStack_368 = auVar3._8_8_;
  dVar300 = local_1538[10] * 3309407.0851908242;
  dVar349 = local_1538[0xd] * 30000000.0;
  auVar34._8_4_ = SUB84(dVar349 + dStack_1040,0);
  auVar34._0_8_ = local_1048 - dVar300;
  auVar34._12_4_ = (int)((ulong)(dVar349 + dStack_1040) >> 0x20);
  dVar211 = local_1538[4] * -1.316420144391347e-05;
  dVar352 = local_1538[2] * 30000000.0;
  dVar243 = local_1538[1] * -9.717850050148037e-07;
  local_950 = local_950 - dVar243;
  dStack_8a8 = dVar352 + dStack_8a8;
  dVar334 = local_1538[0xd] * local_1538[2] * 0.0 +
            (0.0 - ((local_1458 + dStack_1420) - (dStack_1410 + local_1468)) * 0.0006666666666666666
            ) * -1.316420144391347e-05 * local_1538[4] * local_1538[0xb];
  dVar339 = local_1538[2] * local_1538[0xd] * 0.0 +
            (0.0 - ((local_1418 + dStack_1470) - (local_1468 + dStack_1410)) * 0.0006666666666666666
            ) * -9.717850050148037e-07 * local_1538[1] * local_1538[0xc];
  dVar217 = local_1538[0xb] * -1.316420144391347e-05;
  dVar372 = local_1538[0xd] * local_1538[2] * 30000000.0 +
            local_1538[4] * local_1538[0xb] * -1.316420144391347e-05;
  dVar377 = local_1538[2] * local_1538[0xd] * 30000000.0 +
            local_1538[1] * local_1538[0xc] * -9.717850050148037e-07;
  dVar333 = local_1538[0xc] * -9.717850050148037e-07;
  dVar53 = dStack_330 + dVar267 + dVar334;
  auVar35._8_4_ = SUB84(dStack_328 + dVar339,0);
  auVar35._0_8_ = dVar53;
  auVar35._12_4_ = (int)((ulong)(dStack_328 + dVar339) >> 0x20);
  dStack_328 = auVar35._8_8_;
  dVar335 = local_1538[0xd] * 30000000.0;
  dVar340 = local_1538[0xe] * 11893241.704910735;
  dVar280 = local_1538[0xe] * local_1538[2] * 11893241.704910735 +
            local_1538[4] * local_1538[0xd] * -2811.709768791155;
  dVar313 = local_1538[0xd] * -2811.709768791155;
  dVar54 = local_1538[4] * -2811.709768791155;
  dVar213 = local_1538[2] * 11893241.704910735;
  dVar247 = local_1538[9] * -14.898178128775022;
  local_8f8 = (((((local_8f8 - dVar50) - dVar249) - dVar352) - dVar352) - dVar54) - dVar247;
  local_888 = local_888 - dVar247;
  dVar244 = local_1538[2] * 11574309.207109384;
  local_6e8 = local_6e8 - dVar244;
  local_690 = local_690 + dVar244;
  dVar130 = local_1538[0x10] * 11574309.207109384;
  dVar143 = local_1538[0x11] * 132000000.0;
  local_1018 = local_1018 - dVar130;
  local_1030 = (((dVar214 + local_1030 + dVar22) - dVar349) - dVar335) + dVar340 + dVar130;
  dStack_1028 = ((dVar278 + dStack_1028) - dVar340) + dVar143;
  dVar131 = local_1538[0xd] * -14.898178128775022;
  dVar144 = local_1538[0xe] * -0.00037751521951089154;
  dVar218 = local_1538[9] * -0.00037751521951089154;
  local_848 = ((local_848 - dVar215) - dVar213) - dVar218;
  local_7d0 = local_7d0 - dVar218;
  dVar219 = local_1538[2] * 132000000.0;
  local_5d8 = local_5d8 + dVar219;
  dVar355 = local_1538[0xe] * local_1538[2] * 9416.207166531589 +
            (0.0007917275541994261 -
            ((local_1458 + dStack_1410) - (local_1468 + local_1408)) * 0.0006666666666666666) *
            -2811.709768791155 * local_1538[4] * local_1538[0xd];
  dVar175 = local_1538[2] * local_1538[0x10] * 14690.152683074684 +
            (0.0012692034073231281 -
            ((dStack_1430 + dStack_1410) - (local_1468 + local_13f8)) * 0.0006666666666666666) *
            -14.898178128775022 * local_1538[9] * local_1538[0xd];
  dVar183 = local_1538[2] * local_1538[0x11] * 0.0 +
            (0.0 - ((dStack_1430 + local_1408) - (local_1468 + dStack_13f0)) * 0.0006666666666666666
            ) * -0.00037751521951089154 * local_1538[9] * local_1538[0xe];
  dVar254 = local_1538[2] * local_1538[0x10] * 11574309.207109384 +
            local_1538[9] * local_1538[0xd] * -14.898178128775022;
  dVar268 = local_1538[2] * local_1538[0x11] * 132000000.0 +
            local_1538[9] * local_1538[0xe] * -0.00037751521951089154;
  dVar356 = local_1538[2] * local_1538[0x12] * 16686316.432824839 +
            local_1538[0x11] * local_1538[4] * -64695.71318864056;
  dVar245 = local_1538[2] * local_1538[0x12] * 42593.141495423035 +
            (0.00255257903485727 -
            ((dStack_13f0 + local_1458) - (local_13e8 + local_1468)) * 0.0006666666666666666) *
            -64695.71318864056 * local_1538[0x11] * local_1538[4];
  dVar95 = local_1538[0x11] * -64695.71318864056;
  dVar314 = local_1538[4] * -64695.71318864056;
  local_638 = (local_638 - dVar219) - dVar314;
  dVar220 = local_1538[2] * 16686316.432824839;
  local_588 = local_588 - dVar220;
  dVar55 = local_1538[0xb] * 0.2714339464219018;
  dStack_1040 = auVar34._8_8_;
  local_f88 = dVar55 + local_f88;
  dVar276 = local_1538[3] * 0.2714339464219018;
  local_a58 = (local_a58 - dVar211) + dVar276;
  dVar332 = local_1538[2] * -0.32764529688590877;
  local_9a8 = (local_9a8 - dVar243) + dVar332;
  local_9a0 = local_9a0 - dVar332;
  dVar221 = local_1538[0xe] * 148.64629960980085;
  dVar222 = local_1538[6] * -1595994.8383312945;
  dVar353 = local_1538[3] * 148.64629960980085;
  dVar255 = local_1538[0xb] * local_1538[3] * 0.002901780483165377 +
            (0.01069055850020694 -
            ((local_1468 + local_1418) - (dStack_1460 + dStack_1420)) * 0.0006666666666666666) *
            -0.32764529688590877 * local_1538[2] * local_1538[0xc];
  dVar269 = local_1538[0xe] * local_1538[3] * 1.3298008048685055 +
            (0.008946074058750577 -
            ((dStack_1410 + local_1448) - (dStack_1460 + local_1408)) * 0.0006666666666666666) *
            -1595994.8383312945 * local_1538[6] * local_1538[0xd];
  dVar362 = local_1538[0xc] * -0.32764529688590877;
  dVar239 = local_1538[0x12] * 16686316.432824839;
  local_1010 = (local_1010 - dVar143) + dVar239;
  local_1008 = local_1008 - dVar239;
  dVar373 = (dVar212 + adStack_1150[0x1a]) - dVar362;
  dVar371 = adStack_1150[0x1b] + dVar300 + dVar349 + dVar340 + dVar239;
  auVar36._8_4_ = SUB84(dVar371,0);
  auVar36._0_8_ = dVar373;
  auVar36._12_4_ = (int)((ulong)dVar371 >> 0x20);
  dStack_1040 = dStack_1040 - dVar362;
  local_1048 = local_1048 - dVar300;
  local_1038 = dVar362 + local_1038 + dVar335;
  dVar315 = local_1538[0xb] * local_1538[3] * 0.2714339464219018 +
            local_1538[2] * local_1538[0xc] * -0.32764529688590877;
  dVar327 = local_1538[0xe] * local_1538[3] * 148.64629960980085 +
            local_1538[6] * local_1538[0xd] * -1595994.8383312945;
  dVar162 = dVar377 + local_1608[0xc] + dVar315;
  dVar371 = dVar254 + (((dVar363 + local_1608[0xd] + dVar72) - dVar372) - dVar377) + dVar280 +
            dVar327;
  auVar158._8_4_ = SUB84(dVar371,0);
  auVar158._0_8_ = dVar162;
  auVar158._12_4_ = (int)((ulong)dVar371 >> 0x20);
  local_1608[0xd] = auVar158._8_8_;
  dVar96 = local_1538[0xd] * -1595994.8383312945;
  dStack_db8 = auVar121._8_8_;
  dVar371 = ((dVar94 - dVar334) - dVar339) + dVar355 + dVar175 + dVar269;
  auVar37._8_4_ = SUB84(dVar371,0);
  auVar37._0_8_ = dStack_328 + dVar255;
  auVar37._12_4_ = (int)((ulong)dVar371 >> 0x20);
  dStack_320 = auVar37._8_8_;
  dVar281 = local_1538[4] * -10782603.17894348;
  adStack_1150[0x1b] = auVar36._8_8_;
  dVar373 = dVar373 - dVar281;
  auVar159._8_4_ = SUB84(adStack_1150[0x1b] + dVar281,0);
  auVar159._0_8_ = dVar373;
  auVar159._12_4_ = (int)((ulong)(adStack_1150[0x1b] + dVar281) >> 0x20);
  adStack_1150[0x18] =
       (adStack_1150[0x18] + dVar129 + dVar22 + dVar214 + dVar278 + dVar335) - dVar281;
  dVar371 = local_1538[2] * -10782603.17894348;
  dVar282 = (dVar252 + local_f20) - dVar371;
  dVar176 = (local_f30 + dVar312) - dVar371;
  dVar94 = dStack_f18 + dVar293 + dVar217 + dVar313 + dVar95 + dVar371;
  dVar371 = dVar371 + ((((((dStack_f28 - dVar312) - dVar252) - dVar293) - dVar217) - dVar313) -
                      dVar95);
  auVar87._8_4_ = SUB84(dVar94,0);
  auVar87._0_8_ = dVar282;
  auVar87._12_4_ = (int)((ulong)dVar94 >> 0x20);
  auVar38._8_4_ = SUB84(dVar371,0);
  auVar38._0_8_ = dVar176;
  auVar38._12_4_ = (int)((ulong)dVar371 >> 0x20);
  dVar343 = local_1538[0] * -0.4971315070618765;
  dVar350 = local_1538[1] * 659416.0587695736;
  dVar235 = local_1538[3] * -0.4971315070618765;
  local_11e0 = local_11e0 + dVar235;
  local_11c8 = local_11c8 - dVar235;
  dVar371 = local_1538[6] * 19568365.243600544;
  dVar240 = local_1538[3] * 659416.0587695736;
  adStack_1150[3] =
       (((((adStack_1150[3] - dVar251) - dVar354) - dVar361) - dVar277) - dVar333) + dVar240;
  dVar348 = (adStack_1150[4] - dVar240) + dVar371;
  dVar94 = dVar251 + adStack_1150[5] + dVar240;
  auVar39._8_4_ = SUB84(dVar94,0);
  auVar39._0_8_ = dVar348;
  auVar39._12_4_ = (int)((ulong)dVar94 >> 0x20);
  dVar94 = local_1538[3] * local_1538[1] * 659416.0587695736 +
           local_1538[2] * local_1538[4] * -10782603.17894348;
  dVar163 = local_1538[3] * local_1538[1] * 2125.623798113147 +
            (0.0032234941352193023 -
            ((local_1468 + local_1458) - (dStack_1470 + dStack_1460)) * 0.0006666666666666666) *
            -10782603.17894348 * local_1538[2] * local_1538[4];
  dVar15 = local_1538[1] * local_1538[6] * 19568365.243600544 +
           local_1538[0] * local_1538[3] * -0.4971315070618765;
  dVar316 = local_1538[1] * local_1538[6] * 4674.103192900765 +
            local_1538[0] * local_1538[3] *
            (0.00023886017736864045 -
            ((dStack_1460 + local_1478) - (dStack_1470 + local_1448)) * 0.0006666666666666666) *
            -0.4971315070618765;
  local_fe8 = local_fe8 + dVar343;
  dVar338 = dVar350 + (local_fd8 - dVar291) + dVar55;
  dVar23 = dVar343 + ((((dVar291 + dStack_fd0) - dVar55) - dVar221) - dVar350);
  auVar4._8_4_ = SUB84(dVar23,0);
  auVar4._0_8_ = dVar338;
  auVar4._12_4_ = (int)((ulong)dVar23 >> 0x20);
  dStack_fd0 = auVar4._8_8_;
  dVar346 = local_1538[1] * 19568365.243600544;
  local_dd8 = local_dd8 + dVar346;
  dVar317 = local_1538[6] * local_1538[1] * 108289848.15442011 +
            local_1538[4] * local_1538[4] * -38.98923487337139;
  dVar177 = local_1538[6] * local_1538[1] * 15379.207897229715 +
            (0.00014201892568266544 -
            ((local_1458 + local_1458) - (local_1448 + dStack_1470)) * 0.0006666666666666666) *
            -38.98923487337139 * local_1538[4] * local_1538[4];
  dVar256 = local_1538[6] * 108289848.15442011;
  adStack_1150[5] = auVar39._8_8_;
  dVar23 = local_1538[4] * -77.97846974674277;
  adStack_1150[7] = (adStack_1150[7] - dVar371) - dVar256;
  dStack_f28 = auVar38._8_8_;
  dStack_f18 = auVar87._8_8_;
  dVar97 = local_1538[1] * 108289848.15442011;
  local_dd0 = (local_dd0 - dVar346) - dVar97;
  dVar16 = local_1538[0] * -120140.80184495587;
  dVar17 = local_1538[1] * 2429212.6664140443;
  local_b18 = local_b18 + dVar17;
  local_b10 = local_b10 - dVar17;
  dVar18 = local_1538[1] * local_1538[10] * 8512.899029058015 +
           (0.003504386069921407 -
           ((dStack_1430 + local_1478) - (dStack_1470 + local_1428)) * 0.0006666666666666666) *
           -120140.80184495587 * local_1538[0] * local_1538[9];
  dVar241 = local_1538[0xd] * local_1538[1] * 0.0 +
            (0.0 - ((dStack_1420 + local_1478) - (dStack_1410 + dStack_1470)) *
                   0.0006666666666666666) * -3.716149717925534e-05 * local_1538[0xb] * local_1538[0]
  ;
  dVar344 = local_1538[9] * -120140.80184495587;
  dVar351 = local_1538[0xb] * -3.716149717925534e-05;
  local_11a8 = local_11a8 - dVar344;
  dStack_11a0 = dVar351 + dStack_11a0;
  dVar257 = local_1538[10] * 2429212.6664140443;
  dVar270 = local_1538[0xd] * 73400000.0;
  adStack_1150[0xb] = adStack_1150[0xb] - dVar257;
  dVar98 = local_1538[0] * -3.716149717925534e-05;
  local_a68 = local_a68 + dVar98;
  dVar374 = local_1538[1] * 73400000.0;
  dVar294 = local_1538[1] * local_1538[10] * 2429212.6664140443 +
            local_1538[0] * local_1538[9] * -120140.80184495587;
  dVar303 = local_1538[0xd] * local_1538[1] * 73400000.0 +
            local_1538[0xb] * local_1538[0] * -3.716149717925534e-05;
  dVar283 = (local_338 - dVar216) - dVar18;
  dVar53 = dVar241 + (dVar53 - dVar255);
  auVar5._8_4_ = SUB84(dVar53,0);
  auVar5._0_8_ = dVar283;
  auVar5._12_4_ = (int)((ulong)dVar53 >> 0x20);
  dStack_330 = auVar5._8_8_;
  dVar178 = local_1538[1] * local_1538[0xe] * 16575581.576889673 +
            local_1538[0xd] * local_1538[0] * -4521.295558798051;
  dVar56 = local_1538[1] * local_1538[0xe] * 23743.85449528333 +
           (0.0014324598135602037 -
           ((dStack_1410 + local_1478) - (dStack_1470 + local_1408)) * 0.0006666666666666666) *
           -4521.295558798051 * local_1538[0xd] * local_1538[0];
  dVar132 = local_1538[0xd] * -4521.295558798051;
  local_1190 = (local_1190 - dVar351) + dVar132;
  local_1188 = local_1188 - dVar132;
  dVar318 = local_1538[0xe] * 16575581.576889673;
  adStack_1150[0xe] = (((dVar361 + adStack_1150[0xe] + dVar354) - dVar333) - dVar270) + dVar318;
  dVar357 = local_1538[0] * -4521.295558798051;
  local_908 = local_908 + dVar374 + dVar357;
  local_900 = ((local_900 + dVar50 + dVar249 + dVar352) - dVar374) - dVar357;
  dVar53 = local_1538[1] * 16575581.576889673;
  local_858 = local_858 + dVar53;
  dVar164 = local_1538[1] * local_1538[0xf] * 32000000.0 +
            local_1538[4] * local_1538[9] * -10291.734087429853;
  dVar258 = local_1538[1] * local_1538[0xf] * 0.0 +
            (0.0 - ((local_1458 + dStack_1430) - (dStack_1470 + dStack_1400)) *
                   0.0006666666666666666) * -10291.734087429853 * local_1538[4] * local_1538[9];
  dVar133 = local_1538[0xf] * 32000000.0;
  adStack_1150[0x10] = adStack_1150[0x10] - dVar133;
  dVar99 = local_1538[9] * -10291.734087429853;
  dVar19 = local_1538[4] * -10291.734087429853;
  dVar223 = local_1538[1] * 32000000.0;
  local_7a0 = local_7a0 - dVar223;
  dVar165 = local_1538[1] * local_1538[0x12] * 9958163.265843963 +
            local_1538[0] * local_1538[0x11] * -44546.96801065157;
  dVar100 = local_1538[1] * local_1538[0x12] * 29384.200706874846 +
            (0.0029507651082264627 -
            ((local_1478 + dStack_13f0) - (dStack_1470 + local_13e8)) * 0.0006666666666666666) *
            -44546.96801065157 * local_1538[0] * local_1538[0x11];
  dVar134 = local_1538[0x11] * -44546.96801065157;
  local_1170 = local_1170 + dVar134;
  local_1168[0] = local_1168[0] - dVar134;
  dVar224 = local_1538[0x12] * 9958163.265843963;
  adStack_1150[0x13] = adStack_1150[0x13] - dVar224;
  dVar20 = local_1538[0] * -44546.96801065157;
  local_648 = local_648 + dVar20;
  dVar57 = local_1538[1] * 9958163.265843963;
  local_598 = local_598 + dVar57;
  local_590 = local_590 - dVar57;
  dVar295 = local_1538[0] * local_1538[4] * 4271828.084344627 +
            local_1538[1] * local_1538[5] * -121922.904977942;
  dVar135 = local_1538[0] * local_1538[4] * 7577.3366907946565 +
            (0.0017737925172045287 -
            ((dStack_1470 + dStack_1450) - (local_1478 + local_1458)) * 0.0006666666666666666) *
            -121922.904977942 * local_1538[1] * local_1538[5];
  dVar101 = local_1538[4] * 34296205.4093863;
  dVar345 = local_1538[4] * 4271828.084344627;
  local_11d8 = (dVar250 + local_11d8) - dVar345;
  local_11d0 = dVar345 + local_11d0;
  dVar225 = local_1538[5] * -121922.904977942;
  adStack_1150[6] = dVar225 + adStack_1150[6];
  dVar284 = local_1538[0] * 4271828.084344627;
  local_f38 = (local_f38 - dVar312) - dVar284;
  dVar58 = local_1538[1] * -121922.904977942;
  local_e88 = local_e88 - dVar58;
  local_e80 = local_e80 + dVar58;
  dVar226 = local_1538[5] * -100069.45216403608;
  adStack_1150[0x1b] = auVar159._8_8_;
  adStack_1150[0x1c] = dVar226 + adStack_1150[0x1c];
  dVar227 = local_1538[5] * -0.024867627282709664;
  dVar312 = (dVar350 + dVar291 + dStack_fc8) - dVar227;
  auVar160._8_4_ = SUB84(dVar312,0);
  auVar160._0_8_ = dVar227 + dStack_fd0;
  auVar160._12_4_ = (int)((ulong)dVar312 >> 0x20);
  dStack_fc8 = auVar160._8_8_;
  dVar236 = local_1538[2] * -100069.45216403608;
  dVar237 = local_1538[3] * -0.024867627282709664;
  auVar6._8_4_ = SUB84(dStack_e70 + dVar237,0);
  auVar6._0_8_ = local_e78 + dVar236;
  auVar6._12_4_ = (int)((ulong)(dStack_e70 + dVar237) >> 0x20);
  local_e58 = local_e58 - dVar237;
  dVar312 = ((((dStack_da8 - dVar248) + dVar96) - dVar346) - dVar97) - dVar101;
  dVar102 = dVar101 + ((dVar248 + local_dc0) - dVar96) + dVar346;
  dVar248 = (dVar97 + dVar97 + dStack_db8) - dVar101;
  auVar40._8_4_ = SUB84(dVar312,0);
  auVar40._0_8_ = local_db0 + dVar101;
  auVar40._12_4_ = (int)((ulong)dVar312 >> 0x20);
  auVar170._8_4_ = SUB84(dVar248,0);
  auVar170._0_8_ = dVar102;
  auVar170._12_4_ = (int)((ulong)dVar248 >> 0x20);
  dVar103 = local_1538[6] * 34296205.4093863;
  dVar114 = local_1538[7] * 20000000.0;
  dVar364 = local_1538[8] * 30000000.0;
  dVar370 = local_1538[4] * 6077655.854054699;
  dVar59 = (((double)local_f08._0_8_ - dVar252) - dVar23) - dVar103;
  auVar88._8_4_ = SUB84(dVar114,0);
  auVar88._0_8_ = dVar114;
  auVar88._12_4_ = (int)((ulong)dVar114 >> 0x20);
  dVar346 = local_1538[0xe] * local_1538[1];
  dVar312 = local_1538[4] * local_1538[6] * 34296205.4093863 +
            local_1538[3] * local_1538[5] * -0.024867627282709664;
  dVar24 = local_1538[4] * local_1538[7] * 20000000.0 + dVar346 * -0.029479148639814108;
  auVar41._8_4_ = SUB84((double)local_f08._8_8_ - dVar114,0);
  auVar41._0_8_ = dVar59;
  auVar41._12_4_ = (int)((ulong)((double)local_f08._8_8_ - dVar114) >> 0x20);
  dVar358 = local_1538[4] * 20000000.0;
  dVar336 = local_1538[4] * local_1538[8] * 30000000.0 + dVar346 * -0.001025849604117461;
  dVar341 = local_1538[4] * local_1538[4] * 3038827.9270273494 +
            local_1538[5] * local_1538[2] * -100069.45216403608;
  dVar60 = ((((local_1608[6] - dVar52) + dVar327) - dVar15) - dVar317) - dVar312;
  dVar248 = (local_1608[7] - dVar72) - dVar24;
  auVar42._8_4_ = SUB84(dVar248,0);
  auVar42._0_8_ = dVar60;
  auVar42._12_4_ = (int)((ulong)dVar248 >> 0x20);
  dVar301 = local_1538[0xe] * -0.029479148639814108;
  dVar378 = local_1538[0xe] * -0.001025849604117461;
  adStack_1150[0xf] = dVar378 + ((dVar277 + adStack_1150[0xf]) - dVar318) + dVar301;
  dVar233 = ((dVar176 - dVar23) - dVar99) + dVar284 + dVar114 + dVar364;
  auVar171._8_4_ = SUB84(dStack_f28 + dVar370,0);
  auVar171._0_8_ = dVar233;
  auVar171._12_4_ = (int)((ulong)(dStack_f28 + dVar370) >> 0x20);
  dVar179 = local_1538[4] * 30000000.0;
  dVar166 = local_1538[1] * -0.029479148639814108;
  dVar169 = local_1538[1] * -0.001025849604117461;
  local_850 = ((local_850 + dVar215) - dVar53) + dVar166 + dVar169;
  auVar7._8_4_ = SUB84(dStack_818 - dVar169,0);
  auVar7._0_8_ = dStack_820 - dVar166;
  auVar7._12_4_ = (int)((ulong)(dStack_818 - dVar169) >> 0x20);
  dStack_818 = auVar7._8_8_;
  dVar259 = local_1538[4] * local_1538[6] * -3835.2049190811504 +
            (-0.00011182592573438223 -
            ((dStack_1450 + dStack_1460) - (local_1458 + local_1448)) * 0.0006666666666666666) *
            -0.024867627282709664 * local_1538[3] * local_1538[5];
  dVar271 = local_1538[4] * local_1538[7] * 0.0 +
            (0.0 - ((local_1408 + dStack_1470) - (local_1458 + dStack_1440)) * 0.0006666666666666666
            ) * -0.029479148639814108 * dVar346;
  dVar319 = local_1538[4] * local_1538[8] * 0.0 +
            (0.0 - ((local_1408 + dStack_1470) - (local_1438 + local_1458)) * 0.0006666666666666666)
            * -0.001025849604117461 * dVar346;
  dVar328 = local_1538[4] * local_1538[4] * 3428.0853547552383 +
            (0.0011280945934009068 -
            ((dStack_1450 + local_1468) - (local_1458 + local_1458)) * 0.0006666666666666666) *
            -100069.45216403608 * local_1538[5] * local_1538[2];
  local_1258._8_8_ = auVar42._8_8_;
  dVar61 = ((((local_358 - dVar292) + dVar269) - dVar316) - dVar177) - dVar259;
  auVar43._8_4_ = SUB84(dStack_350 - dVar271,0);
  auVar43._0_8_ = dVar61;
  auVar43._12_4_ = (int)((ulong)(dStack_350 - dVar271) >> 0x20);
  dStack_350 = auVar43._8_8_;
  dVar248 = local_1538[5] * -37781.99143773652;
  local_d00 = local_d00 + dVar248;
  dVar325 = local_1538[9] * 1097137.153737377;
  dVar73 = local_1538[9] * 25010000.0;
  local_f08._8_8_ = auVar41._8_8_;
  dVar62 = local_1538[7] * -37781.99143773652;
  dVar74 = local_1538[8] * -37124457.44676649;
  dVar326 = local_1538[5] * -37124457.44676649;
  dVar63 = local_1538[4] * 1097137.153737377;
  dVar238 = local_1538[4] * 25010000.0;
  dVar136 = local_1538[9] * local_1538[4] * 1097137.153737377 +
            local_1538[5] * local_1538[7] * -37781.99143773652;
  dVar145 = local_1538[4] * local_1538[9] * 25010000.0 +
            local_1538[5] * local_1538[8] * -37124457.44676649;
  dVar346 = dVar145 + ((local_1608[8] - dVar363) - dVar336);
  auVar122._8_4_ = SUB84(dVar346,0);
  auVar122._0_8_ = dVar136 + (double)local_1258._8_8_;
  auVar122._12_4_ = (int)((ulong)dVar346 >> 0x20);
  dVar346 = local_1538[9] * local_1538[4] * 2500.221646810261 +
            (0.00227885970162737 -
            ((dStack_1450 + dStack_1440) - (dStack_1430 + local_1458)) * 0.0006666666666666666) *
            -37781.99143773652 * local_1538[5] * local_1538[7];
  dVar25 = local_1538[4] * local_1538[9] * 0.0 +
           (0.0 - ((dStack_1450 + local_1438) - (local_1458 + dStack_1430)) * 0.0006666666666666666)
           * -37124457.44676649 * local_1538[5] * local_1538[8];
  dVar97 = dVar25 + ((local_348 - dVar93) - dVar319);
  auVar8._8_4_ = SUB84(dVar97,0);
  auVar8._0_8_ = dVar346 + dStack_350;
  auVar8._12_4_ = (int)((ulong)dVar97 >> 0x20);
  local_348 = auVar8._8_8_;
  dVar64 = local_1538[4] * local_1538[10] * 4238127.66170656 +
           local_1538[5] * local_1538[9] * -5982.3326554224905;
  dVar228 = local_1538[4] * local_1538[10] * 7478.008612521503 +
            (0.0017644604432492119 -
            ((dStack_1430 + dStack_1450) - (local_1428 + local_1458)) * 0.0006666666666666666) *
            -5982.3326554224905 * local_1538[5] * local_1538[9];
  dVar97 = local_1538[10] * 4238127.66170656;
  local_ee8 = (local_ee8 - dVar293) - dVar97;
  dVar359 = local_1538[9] * -5982.3326554224905;
  local_e40 = ((local_e40 - dVar62) - dVar74) + dVar359;
  local_e38 = local_e38 - dVar359;
  dVar167 = local_1538[5] * -5982.3326554224905;
  local_ba0 = local_ba0 + dVar63 + dVar238 + dVar167;
  dVar104 = local_1538[4] * 4238127.66170656;
  local_af8 = (local_af8 + dVar253) - dVar104;
  local_af0 = local_af0 + dVar104;
  dVar260 = local_1538[1] * -27278.71839873273;
  uStack_13c0 = auVar88._8_8_;
  local_9b0 = local_9b0 + dVar243 + dVar260;
  dVar137 = local_1538[0xb] * -7.225013822780462e-07;
  dVar234 = local_1538[4] * 369528.79729527823;
  dVar146 = local_1538[5] * -7.225013822780462e-07;
  dVar138 = dVar146 + ((((dStack_a10 + dVar211) - dVar276) + dVar98) - dVar234);
  dVar176 = dVar234 + dVar276 + dStack_a08;
  auVar123._8_4_ = SUB84(dVar176,0);
  auVar123._0_8_ = dVar138;
  auVar123._12_4_ = (int)((ulong)dVar176 >> 0x20);
  dStack_a08 = auVar123._8_8_;
  dVar65 = local_1538[4] * 50000000.0;
  dVar176 = local_1538[5] * local_1538[0xb];
  auVar9._8_4_ = SUB84(local_1538[1] * local_1538[0xc],0);
  auVar9._0_8_ = dVar176;
  auVar9._12_4_ = (int)((ulong)(local_1538[1] * local_1538[0xc]) >> 0x20);
  dVar376 = local_1538[0xc] * -27278.71839873273;
  adStack_1150[0xd] = dVar376 + adStack_1150[0xd] + dVar333;
  dVar105 = local_1538[0xd] * 50000000.0;
  dVar115 = local_1538[0xb] * 369528.79729527823;
  dStack_f28 = auVar171._8_8_;
  dVar375 = local_1538[0xe] * 22295026.02480445;
  dVar320 = local_1538[0xd] * -173.56959160214726;
  local_e20 = (local_e20 - dVar137) + dVar320;
  local_e18 = local_e18 - dVar320;
  dVar180 = local_1538[5] * -173.56959160214726;
  local_8e0 = local_8e0 + dVar65 + dVar180;
  dVar296 = local_1538[4] * 22295026.02480445;
  local_830 = local_830 + dVar296;
  dStack_1640 = auVar9._8_8_;
  dVar139 = local_1538[4] * local_1538[0xd] * 50000000.0 + dVar176 * -7.225013822780462e-07;
  dVar147 = local_1538[4] * local_1538[0xb] * 369528.79729527823 + dStack_1640 * -27278.71839873273;
  dVar181 = ((dVar303 + ((dVar372 + local_1608[0xb]) - dVar315)) - dVar147) + dVar139;
  dVar162 = dVar162 + dVar147;
  auVar172._8_4_ = SUB84(dVar162,0);
  auVar172._0_8_ = dVar181;
  auVar172._12_4_ = (int)((ulong)dVar162 >> 0x20);
  local_1608[0xc] = auVar172._8_8_;
  dVar168 = local_1538[4] * local_1538[0xe] * 22295026.02480445 +
            local_1538[5] * local_1538[0xd] * -173.56959160214726;
  dVar66 = local_1538[4] * local_1538[0xd] * 0.0 +
           (0.0 - ((dStack_1450 + dStack_1420) - (dStack_1410 + local_1458)) * 0.0006666666666666666
           ) * -7.225013822780462e-07 * dVar176;
  dVar75 = local_1538[4] * local_1538[0xb] * 308.3061146970958 +
           (0.0008343222962694802 -
           ((dStack_1470 + local_1418) - (dStack_1420 + local_1458)) * 0.0006666666666666666) *
           -27278.71839873273 * dStack_1640;
  dVar329 = dStack_328 + dVar255 + dVar75;
  dVar285 = local_1538[4] * local_1538[0xe] * 15309.867045680163 +
            (0.0006866942890601289 -
            ((dStack_1450 + dStack_1410) - (local_1458 + local_1408)) * 0.0006666666666666666) *
            -173.56959160214726 * local_1538[5] * local_1538[0xd];
  dVar365 = (((dStack_320 - dVar241) + dVar56) - dVar66) + dVar285;
  dVar176 = local_1538[0x12] * 14307411.985466668;
  local_f10 = dVar370 + dVar284 + local_f10 + dVar103 + dVar325 + dVar73 + dVar97 + dVar105 +
              dVar375 + dVar176;
  local_eb0 = local_eb0 + dVar95 + dVar176;
  local_ea8 = (local_ea8 - dVar95) - dVar176;
  dVar95 = local_1538[0x11] * -1826.7180743084757;
  local_e68 = ((((((((local_e68 - dVar58) - (dVar236 + dVar236)) - dVar237) - dVar62) - dVar74) -
                dVar359) - dVar137) - dVar320) - dVar95;
  local_e00 = local_e00 + dVar95;
  local_df8 = local_df8 - dVar95;
  dVar261 = local_1538[5] * -1826.7180743084757;
  local_628 = (local_628 + dVar314) - dVar261;
  local_620 = local_620 + dVar261;
  dVar162 = local_1538[4] * -1.061382456225949e-08;
  dStack_da8 = auVar40._8_8_;
  dVar106 = (local_828 + dVar353) - dVar162;
  dVar252 = (dStack_820 - dVar166) - dVar162;
  auVar89._8_4_ = SUB84(dVar252,0);
  auVar89._0_8_ = dVar106;
  auVar89._12_4_ = (int)((ulong)dVar252 >> 0x20);
  dStack_820 = auVar89._8_8_;
  local_1378._8_4_ = SUB84(local_1408,0);
  local_1378._0_8_ = local_1428;
  uStack_136c = (int)((ulong)local_1408 >> 0x20);
  dVar252 = local_1538[10] * -0.5136789314491079;
  local_f98 = dVar252 + local_f98;
  dVar107 = local_1538[0xe] * -1.061382456225949e-08;
  dVar116 = local_1538[0xf] * -22389.705712050265;
  dStack_db8 = auVar170._8_8_;
  dVar342 = ((dVar364 + (local_ec8 - dVar313) + dVar114) - dVar375) + dVar107;
  dVar26 = (dStack_ec0 - dVar99) + dVar116;
  auVar10._8_4_ = SUB84(dVar26,0);
  auVar10._0_8_ = dVar342;
  auVar10._12_4_ = (int)((ulong)dVar26 >> 0x20);
  dVar26 = local_1538[6] * 1000000.0;
  dVar266 = local_1538[6] * 20000000.0;
  dVar117 = ((((dStack_ba8 + dVar279 + dVar19) - dVar63) - dVar238) - dVar167) + dVar266;
  auVar90._8_4_ = SUB84(dVar117,0);
  auVar90._0_8_ = local_bb0 + dVar26;
  auVar90._12_4_ = (int)((ulong)dVar117 >> 0x20);
  local_b98 = (local_b98 - dVar26) - dVar266;
  dVar117 = local_1538[4] * -22389.705712050265;
  local_788 = local_788 + dVar223 + dVar117;
  uStack_1280 = 0;
  dVar108 = local_1538[0x12] * local_1538[4] * 23005.037159633022 +
            (0.0016079104441111584 -
            ((dStack_13f0 + dStack_1450) - (local_13e8 + local_1458)) * 0.0006666666666666666) *
            -1826.7180743084757 * local_1538[5] * local_1538[0x11];
  dVar67 = local_1538[4] * 14307411.985466668;
  local_578 = (local_578 + dVar220) - dVar67;
  local_570 = local_570 + dVar67;
  dVar321 = local_1538[9] * 20000000.0;
  dVar229 = local_1538[6] * 20000000.0;
  dVar148 = (((dStack_cf0 - dVar288) - dVar358) + dVar248) - dVar229;
  auVar124._8_4_ = SUB84(dVar148,0);
  auVar124._0_8_ = local_cf8 - dVar229;
  auVar124._12_4_ = (int)((ulong)dVar148 >> 0x20);
  local_cb8 = dVar229 + dVar358 + local_cb8;
  dVar68 = local_1538[9] * 1000000.0;
  dVar76 = local_1538[7] * 20000000.0;
  local_da0 = local_da0 - dVar76;
  local_d88 = local_d88 + dVar68;
  dVar148 = local_1538[3] * -0.5136789314491079;
  local_b00 = local_b00 + dVar148;
  local_ae8 = local_ae8 - dVar148;
  dVar21 = local_1538[6] * local_1538[7] * 20000000.0 +
           local_1538[0xe] * local_1538[4] * -1.061382456225949e-08;
  dVar27 = local_1538[0x12] * local_1538[4] * 14307411.985466668 +
           local_1538[5] * local_1538[0x11] * -1826.7180743084757;
  dVar262 = local_1538[6] * local_1538[9] * 20000000.0 +
            local_1538[0xf] * local_1538[4] * -22389.705712050265;
  dStack_13a0 = local_1538[9] * local_1538[6] * 1000000.0 +
                local_1538[10] * local_1538[3] * -0.5136789314491079;
  local_1608[8] = auVar122._8_8_;
  dVar109 = ((((((local_1608[9] - dVar369) + dVar174 + dVar254 + dVar268 + dVar294 + dVar164) -
               dVar136) - dVar145) + dVar64) - dStack_13a0) - dVar262;
  dVar28 = (((local_1608[10] - dVar174) - dVar294) - dVar64) + dStack_13a0;
  auVar11._8_4_ = SUB84(dVar28,0);
  auVar11._0_8_ = dVar109;
  auVar11._12_4_ = (int)((ulong)dVar28 >> 0x20);
  local_d90 = (local_d90 - dVar68) - dVar321;
  dVar69 = dVar76 + (dStack_d68 - dVar96);
  auVar44._8_4_ = SUB84(dVar321 + dStack_d60,0);
  auVar44._0_8_ = dVar69;
  auVar44._12_4_ = (int)((ulong)(dVar321 + dStack_d60) >> 0x20);
  dVar230 = local_1538[0xb] * 54659.06262097068;
  local_d78 = dVar230 + local_d78;
  dVar28 = local_1538[6] * 54659.06262097068;
  dVar299 = local_1538[4] * -0.001452763170659347;
  local_998 = (local_998 - dVar260) + dVar299;
  local_988 = local_988 - dVar299;
  dVar110 = local_1538[7] * 7980492.798776164;
  local_fb0 = local_fb0 - dVar110;
  dVar322 = local_1538[0xc] * -0.001452763170659347;
  dVar330 = local_1538[0xd] * -4.547251755334367e-05;
  dVar263 = local_1538[3] * local_1538[7] * 2677.2779851191463 +
            (0.00033547777720314666 -
            ((dStack_1410 + local_1458) - (dStack_1440 + dStack_1460)) * 0.0006666666666666666) *
            -4.547251755334367e-05 * local_1538[0xd] * local_1538[4];
  dVar29 = (((double)local_f08._8_8_ + dVar325) - dVar107) - dVar330;
  local_f08._8_4_ = SUB84(dVar29,0);
  local_f08._0_8_ = ((dVar59 - dVar107) - dVar116) - dVar322;
  local_f08._12_4_ = (int)((ulong)dVar29 >> 0x20);
  dVar70 = local_1538[3] * 7980492.798776164;
  dVar297 = local_1538[4] * -4.547251755334367e-05;
  dVar140 = local_1538[9] * local_1538[6] * 0.0 +
            (0.0 - ((dStack_1460 + local_1428) - (local_1448 + dStack_1430)) * 0.0006666666666666666
            ) * -0.5136789314491079 * local_1538[10] * local_1538[3];
  dVar149 = local_1538[6] * local_1538[7] * 0.0 +
            (0.0 - ((local_1458 + stack0xffffffffffffec90) - (local_1448 + dStack_1440)) *
                   0.0006666666666666666) * -1.061382456225949e-08 * local_1538[0xe] * local_1538[4]
  ;
  dStack_1240 = local_310 - dVar258;
  auVar125._8_4_ = SUB84(dVar149,0);
  auVar125._0_8_ = dVar140;
  auVar125._12_4_ = (int)((ulong)dVar149 >> 0x20);
  local_1208 = (dVar283 - dVar228) + dVar140;
  local_f8 = local_1538[0x14];
  uStack_f0 = 0;
  auVar12._8_4_ = SUB84(local_13d8,0);
  auVar12._0_8_ = local_1448;
  auVar12._12_4_ = (int)((ulong)local_13d8 >> 0x20);
  dStack_ed8 = dStack_ed8 + dVar115 + dVar322;
  local_ed0 = (((local_ed0 - dVar217) + dVar313) - dVar105) + dVar375 + dVar330;
  local_d10 = local_d10 - dVar70;
  local_d08 = ((local_d08 - dVar358) - dVar248) + dVar229 + dVar70;
  dStack_cf0 = auVar124._8_8_;
  local_cc0 = dVar70 + dVar288 + local_cc0;
  local_8e8 = (((local_8e8 + dVar352 + dVar54) - dVar65) - dVar180) + dVar297;
  local_8d0 = (local_8d0 - dVar50) - dVar297;
  local_288 = local_1538[1];
  dVar231 = local_1538[7] * local_1538[0] * 99487.69671959426 +
            local_1538[1] * local_1538[9] * -82454.99861437384;
  dVar182 = local_1538[7] * local_1538[0] * 293.5221550217246 +
            (0.0029503362194525 -
            ((dStack_1470 + dStack_1430) - (dStack_1440 + local_1478)) * 0.0006666666666666666) *
            -82454.99861437384 * local_1538[1] * local_1538[9];
  uStack_1380 = 0;
  local_1268 = local_1538[0x14] * -170727.04371112576;
  uStack_1260 = 0;
  uStack_2d0 = 0;
  dVar313 = local_1538[0xc] * local_1538[4] * -0.001452763170659347;
  dVar29 = local_1538[0xd] * local_1538[4] * -4.547251755334367e-05;
  auVar45._8_4_ = SUB84(dVar29,0);
  auVar45._0_8_ = dVar313;
  auVar45._12_4_ = (int)((ulong)dVar29 >> 0x20);
  local_1238 = local_1438;
  dStack_1230 = dStack_1430;
  uStack_2a0 = 0;
  dVar71 = local_1538[9] * local_1538[9];
  dVar29 = local_1538[7] * local_1538[0x13];
  auVar46._8_4_ = SUB84(dVar29,0);
  auVar46._0_8_ = dVar71;
  auVar46._12_4_ = (int)((ulong)dVar29 >> 0x20);
  local_108 = local_1538[10];
  uStack_100 = 0;
  dStack_12a0 = local_1538[0x13] * local_1538[8];
  dVar232 = local_1538[6] * local_1538[9] * 0.0 +
            local_1538[0xf] * local_1538[4] *
            (0.0 - ((dStack_1400 + local_1458) - (dStack_1430 + local_1448)) * 0.0006666666666666666
            ) * -22389.705712050265;
  dVar242 = dStack_12a0 * 1645.8767818301812 +
            dVar29 * (0.00013419111088125866 -
                     ((dStack_1440 + dStack_13e0) - (local_1438 + dStack_13e0)) *
                     0.0006666666666666666) * -284545.07285187626;
  dStack_1640 = auVar125._8_8_;
  stack0xffffffffffffec90 = dVar365;
  local_1378._0_8_ = dVar329;
  dStack_2c0 = auVar12._8_8_;
  dVar298 = local_1538[0] * 99487.69671959426;
  dVar29 = local_1538[7] * 99487.69671959426;
  local_11c0 = local_11c0 - dVar29;
  dVar366 = local_1538[9] * -82454.99861437384;
  dVar59 = 0.005278183694662841 -
           ((local_1458 + local_1418) - (dStack_1420 + local_1448)) * 0.0006666666666666666;
  dVar283 = 0.00013419111088125866 -
            ((dStack_1440 + local_13d8) - (local_1438 + dStack_2c0)) * 0.0006666666666666666;
  local_e8._8_4_ = SUB84(dVar283,0);
  local_e8._0_8_ = dVar59;
  local_e8._12_4_ = (int)((ulong)dVar283 >> 0x20);
  local_d28 = local_d28 - dVar298;
  dVar323 = local_1538[1] * -82454.99861437384;
  local_2c8 = (((local_bc0 + dVar51) - dVar16) - dVar19) + dVar323;
  local_1248 = (local_b90 + dVar63) - dVar323;
  local_1270 = dVar323 + ((((((dVar144 + (local_b80 - dVar51) + dVar279 + dVar131 + dVar16 + dVar19)
                             - dVar63) - dVar238) + dVar167) - dVar26) - dVar266);
  dVar283 = local_1538[7] * local_1538[9] * 40000000.0 +
            local_1538[1] * local_1538[0x10] * -10.82871927173647;
  dVar141 = local_1538[7] * local_1538[9] * 0.0 +
            (0.0 - ((dStack_1470 + local_13f8) - (dStack_1430 + dStack_1440)) *
                   0.0006666666666666666) * -10.82871927173647 * local_1538[1] * local_1538[0x10];
  dVar337 = local_1538[0x10] * -10.82871927173647;
  adStack_1150[8] = (((adStack_1150[8] - dVar354) - dVar301) - dVar366) - dVar337;
  dVar286 = local_1538[9] * 40000000.0;
  local_d20 = local_d20 + dVar288 + dVar358 + dVar298 + dVar286;
  local_ca8 = dVar286 + local_ca8;
  dVar63 = local_1538[1] * -10.82871927173647;
  local_6c0 = local_6c0 - dVar63;
  local_13a8 = 0.003182934144980015 -
               ((dStack_1430 + dStack_1430) - (dStack_1440 + local_1428)) * 0.0006666666666666666;
  dVar111 = local_1538[10] * 345311.0578145205;
  local_ce0 = dVar111 + dVar111 + ((dVar298 + (local_ce0 - dVar248)) - dVar286);
  local_cd8 = local_cd8 - dVar111;
  dVar313 = local_1538[6] * local_1538[0xb] * 54659.06262097068 + dVar313;
  dStack_2b0 = auVar45._8_8_;
  dVar331 = local_1538[3] * local_1538[7] * 7980492.798776164 + dStack_2b0;
  dStack_1290 = (((local_1608[0xd] - dVar303) + dVar178) - dVar139) + dVar168 + dVar331;
  dVar358 = local_1538[9] * -28308.253956378114;
  dVar367 = local_1538[7] * 40000000.0;
  dVar142 = local_1538[7] * 345311.0578145205;
  local_13b8._0_8_ = local_1538[8] * 12265169.958139507 + local_1538[7] * -284545.07285187626;
  local_13b8._8_8_ = 0;
  local_2b8 = local_ae0 - dVar142;
  local_1210 = (dVar148 + (((local_ac8 - dVar253) - dVar17) - dVar104)) - dVar142;
  local_2d8 = local_4a8;
  local_1398._8_8_ = local_1538[0xf];
  local_1398._0_8_ = local_348;
  local_2a8 = local_4b0;
  local_1388 = local_1538[0xb];
  dVar248 = local_1538[1] * local_1538[4] * local_1538[0xb];
  dVar287 = local_1538[8] * local_1538[0x14] * 7359101.974883704 +
            local_1538[7] * local_1538[0x14] * -170727.04371112576;
  dVar290 = local_1538[3] * local_1538[8] * 28000000.0 + dVar248 * -7.439703734094493e-10;
  dVar264 = local_1538[8] * 7359101.974883704 + local_1538[7] * -170727.04371112576;
  local_1608[10] = auVar11._8_8_;
  dVar112 = local_1538[6] * local_1538[0xb] * 288.5005730915626 +
            dVar59 * -0.001452763170659347 * local_1538[0xc] * local_1538[4];
  dVar118 = local_1538[8] * local_1538[0x14] * 987.5260690981088 +
            (double)local_e8._8_8_ * -170727.04371112576 * local_1538[7] * local_1538[0x14];
  local_1228._8_8_ = auVar46._8_8_;
  dVar324 = local_1538[10] * local_1538[7] * 1099.1023565570054 +
            local_13a8 * -14154.126978189057 * dVar71;
  dVar59 = local_1538[10] * local_1538[7] * 345311.0578145205 + dVar71 * -14154.126978189057;
  dVar288 = dStack_12a0 * 12265169.958139507 + (double)local_1228._8_8_ * -284545.07285187626;
  local_b90 = (local_1248 - dVar367) - dVar358;
  local_ae0 = local_ae0 - dVar142;
  local_4b0 = local_4b0 + (double)local_13b8._0_8_;
  local_4a8 = local_4a8 - (double)local_13b8._0_8_;
  local_400 = local_400 + dVar264;
  local_3f8 = local_3f8 - dVar264;
  dVar61 = (((dVar61 - dStack_1640) - dVar140) - dVar232) - dVar112;
  dVar71 = ((((((dVar346 + dStack_350) - dVar149) - dVar263) - dVar182) - dVar141) - dVar324) +
           dVar242 + dVar118;
  auVar126._8_4_ = SUB84(dVar71,0);
  auVar126._0_8_ = dVar61;
  auVar126._12_4_ = (int)((ulong)dVar71 >> 0x20);
  dStack_350 = auVar126._8_8_;
  dVar265 = ((((((dVar136 + (double)local_1258._8_8_) - dVar21) - dVar331) - dVar231) - dVar283) -
            dVar59) + dVar288 + dVar287;
  dVar288 = ((local_1608[8] - dVar288) - dVar287) - dVar290;
  dVar71 = local_1538[3] * local_1538[8] * 0.0 +
           (0.0 - (((dStack_1470 + local_1458 + dStack_1420) - (local_1438 + dStack_1460)) + -1.0) *
                  0.0006666666666666666) * -7.439703734094493e-10 * dVar248;
  auVar173._8_4_ = SUB84(dVar288,0);
  auVar173._0_8_ = dVar265;
  auVar173._12_4_ = (int)((ulong)dVar288 >> 0x20);
  dVar368 = local_1538[4] * -7.439703734094493e-10 * local_1538[0xb];
  adStack_1150[5] =
       (((((dVar256 + dVar256 + adStack_1150[5] + dVar133) - dVar225) - dVar301) - dVar378) -
       dVar376) + dVar368;
  adStack_1150[4] = dVar348 - dVar368;
  adStack_1150[0xc] = dVar368 + ((dVar270 + adStack_1150[0xc]) - dVar376);
  dVar264 = local_1538[8] * 28000000.0;
  local_fe0 = ((local_fe0 - dVar350) - dVar343) + dVar264;
  dVar347 = local_1538[1] * -7.439703734094493e-10 * local_1538[0xb];
  local_f30 = dVar233 + dVar115 + dVar347;
  local_ef8 = ((local_ef8 - dVar364) + dVar73) - dVar347;
  local_ee0 = dVar347 + ((((local_ee0 + dVar217) - dVar115) + dVar105) - dVar322);
  dVar350 = local_1538[3] * 28000000.0;
  local_c58 = ((local_c58 - dVar179) - dVar326) + dVar350;
  dVar233 = local_1538[1] * -7.439703734094493e-10 * local_1538[4];
  local_a60 = (local_a60 - dVar98) + dVar234 + dVar233;
  local_a48 = (((local_a48 + dVar211) - dVar234) - dVar146) + dVar28 + dVar233;
  dVar360 = local_1538[8] * local_1538[3] * 12000000.0 +
            local_1538[5] * local_1538[0xb] * -2.2921694105207742e-20;
  dVar248 = local_1538[8] * local_1538[3] * 0.0 +
            (0.0 - ((dStack_1450 + dStack_1420) - (dStack_1460 + local_1438)) *
                   0.0006666666666666666) * -2.2921694105207742e-20 *
            local_1538[5] * local_1538[0xb];
  local_1608[5] =
       dVar168 + dVar341 + dVar295 + local_1608[5] + dVar312 + dVar136 + dVar145 + dVar64 + dVar139
       + dVar27 + dVar360;
  dVar287 = local_1538[8] * 12000000.0;
  local_fc0 = local_fc0 + dVar227 + dVar287;
  local_fa8 = (local_fa8 - dVar264) - dVar287;
  local_1608[8] = auVar173._8_8_;
  dVar348 = local_1538[0xb] * -2.2921694105207742e-20;
  dStack_e70 = auVar6._8_8_;
  dStack_e70 = dStack_e70 - dVar348;
  local_e78 = local_e78 + dVar236;
  local_e60 = dVar58 + local_e60 + dVar236 + dVar237 + dVar62 + dVar74 + dVar359 + dVar137 + dVar320
              + dVar95 + dVar348;
  local_e30 = dVar348 + local_e30 + dVar137;
  dVar234 = local_1538[3] * 12000000.0;
  local_c60 = (local_c60 - dVar350) - dVar234;
  local_c50 = local_c50 + dVar326 + dVar234;
  dVar359 = local_1538[5] * -2.2921694105207742e-20;
  local_a40 = local_a40 + dVar146 + dVar359;
  local_360 = dVar328 + dVar135 + local_360 + dVar259 + dVar346 + dVar25 + dVar228 + dVar66 +
              dVar285 + dVar108 + dVar248;
  dVar137 = local_1538[0] * local_1538[8] * 70000000.0 +
            local_1538[1] * local_1538[9] * -1345932.1015318723;
  local_1608[0] =
       ((((local_1608[0] - dVar289) + dVar15 + dVar294 + dVar303 + dVar178 + dVar165) - dVar295) -
       dVar231) - dVar137;
  dVar95 = local_1538[8] * 70000000.0;
  local_11f8 = ((((local_11f8 - dVar250) + dVar235 + dVar344 + dVar351 + dVar132 + dVar134) -
                dVar345) - dVar29) - dVar95;
  local_11f0 = ((((((local_11f0 + dVar250) - dVar235) - dVar344) - dVar351) - dVar132) - dVar134) +
               dVar345 + dVar29 + dVar95;
  local_11b8 = local_11b8 - dVar95;
  local_11b0 = dVar95 + dVar29 + local_11b0 + dVar344;
  dVar132 = local_1538[9] * -1345932.1015318723;
  adStack_1150[1] =
       ((((adStack_1150[1] - dVar251) + dVar371 + dVar257 + dVar270 + dVar318 + dVar224) - dVar225)
       - dVar366) - dVar132;
  dVar217 = local_1538[0] * 70000000.0;
  local_c78 = local_c78 - dVar217;
  dVar95 = local_1538[0] * local_1538[8] * 0.0 +
           (0.0 - ((dStack_1470 + dStack_1430) - (local_1438 + local_1478)) * 0.0006666666666666666)
           * -1345932.1015318723 * local_1538[1] * local_1538[9];
  dVar235 = local_1538[1] * -1345932.1015318723;
  local_bc8 = ((local_bc8 + dVar16) - dVar323) - dVar235;
  local_388 = ((((local_388 - dVar92) + dVar316 + dVar18 + dVar241 + dVar56 + dVar100) - dVar135) -
              dVar182) - dVar95;
  dVar134 = local_1538[5] * local_1538[8] * 30000000.0 +
            local_1538[5] * local_1538[7] * -695983.1958864406;
  dVar29 = local_1538[5] * local_1538[8] * 0.0 +
           (0.0 - ((dStack_1450 + dStack_1440) - (dStack_1450 + local_1438)) * 0.0006666666666666666
           ) * -695983.1958864406 * local_1538[5] * local_1538[7];
  dVar288 = local_1538[8] * 30000000.0 + local_1538[7] * -695983.1958864406;
  local_e50 = local_e50 + dVar62 + dVar288;
  dStack_e48 = ((dStack_e48 + dVar74) - dVar348) - dVar288;
  dVar344 = local_1538[8] * local_1538[9] * 14528743.285075013 +
            local_1538[1] * local_1538[0x10] * -0.09124785266815053;
  dVar348 = local_1538[8] * local_1538[9] * -1852.146791076201 +
            (-0.00012748155533719572 -
            ((dStack_1470 + local_13f8) - (local_1438 + dStack_1430)) * 0.0006666666666666666) *
            -0.09124785266815053 * local_1538[1] * local_1538[0x10];
  dVar236 = local_1538[0x10] * -0.09124785266815053;
  adStack_1150[9] = (((adStack_1150[9] - dVar378) - dVar368) - dVar132) - dVar236;
  dVar288 = (dVar132 + ((dVar366 + (adStack_1150[10] - dVar277) + dVar257 + dVar133) - dVar337)) -
            dVar236;
  auVar161._8_4_ = SUB84(dVar288,0);
  auVar161._0_8_ = adStack_1150[9];
  auVar161._12_4_ = (int)((ulong)dVar288 >> 0x20);
  adStack_1150[10] = auVar161._8_8_;
  adStack_1150[0x11] = dVar236 + dVar337 + adStack_1150[0x11];
  dVar237 = local_1538[9] * 14528743.285075013;
  local_c70 = local_c70 + dVar246 + dVar179 + dVar350 + dVar217 + dVar237;
  local_bf8 = dVar237 + local_bf8;
  dVar320 = local_1538[8] * 14528743.285075013;
  local_b48 = dVar320 + (local_b48 - dVar131) + dVar367;
  dVar250 = local_1538[1] * -0.09124785266815053;
  local_6f0 = local_6f0 + dVar63 + dVar250;
  local_6b8 = local_6b8 - dVar250;
  dStack_6b0 = ((dStack_6b0 + dVar244) - dVar63) - dVar250;
  dVar323 = local_1538[8] * local_1538[10] * 19371657.71343335 +
            local_1538[9] * local_1538[9] * -18421.156298117476;
  dVar288 = local_1538[8] * local_1538[10] * -2469.529054768268 +
            (-0.00012748155533719572 -
            ((dStack_1430 + dStack_1430) - (local_1428 + local_1438)) * 0.0006666666666666666) *
            -18421.156298117476 * local_1538[9] * local_1538[9];
  dVar62 = local_1538[9] * -36842.31259623495;
  dStack_b88 = (((dStack_b88 + dVar238) - dVar235) - dVar320) - dVar62;
  dVar58 = local_1538[8] * 19371657.71343335;
  local_ad8 = local_ad8 - dVar58;
  dVar238 = local_1538[8] * 9000000.0 + local_1538[7] * -208794.958765932;
  local_a30 = local_a30 + dVar238;
  dVar74 = local_1538[8] * 7000000.0 + local_1538[7] * -162396.0790401699;
  local_980 = local_980 + dVar74;
  dVar345 = local_1538[0xe] * -0.006485071999156734;
  local_a28 = (((local_a28 - dVar233) - dVar359) - dVar238) - dVar345;
  dStack_a08 = (dVar28 + dStack_a08) - dVar345;
  local_9f8 = dVar345 + local_9f8;
  dVar238 = local_1538[8] * 14000000.0;
  local_978 = (local_978 - dVar74) - dVar238;
  local_960 = (((local_960 - dVar332) - dVar260) - dVar299) + dVar238;
  local_958 = (dVar299 + dVar260 + dVar332 + local_958 + dVar243) - dVar238;
  local_948 = dVar238 + local_948;
  dVar299 = local_1538[0xb] * -0.006485071999156734;
  dStack_818 = dStack_818 - dVar299;
  local_800 = local_800 + dVar299;
  local_7f8 = local_7f8 - dVar299;
  dVar238 = local_1538[8] * local_1538[0xb] * 9000000.0 +
            local_1538[0xb] * local_1538[7] * -208794.958765932;
  dVar260 = local_1538[8] * local_1538[0xb] * 0.0 +
            (0.0 - ((dStack_1420 + dStack_1440) - (local_1438 + dStack_1420)) *
                   0.0006666666666666666) * -208794.958765932 * local_1538[0xb] * local_1538[7];
  dStack_cf0 = ((((dStack_cf0 - dVar70) - dVar298) - dVar286) - dVar111) +
               local_1538[0x13] * -284545.07285187626 + local_1268 +
               local_1538[5] * -695983.1958864406 + local_1538[0xb] * -208794.958765932 +
               local_1538[0xc] * -162396.0790401699;
  local_cf8 = local_cf8 - dVar229;
  local_ce8 = ((((local_ce8 - local_1538[0x13] * -284545.07285187626) - local_1268) -
               local_1538[5] * -695983.1958864406) - local_1538[0xb] * -208794.958765932) -
              local_1538[0xc] * -162396.0790401699;
  local_1538[8] = local_1538[8] * local_1538[0xc];
  local_c40 = local_1538[5] * 30000000.0 +
              local_1538[0x13] * 12265169.958139507 + local_c40 +
              local_1538[0x14] * 7359101.974883704 + local_1538[0xb] * 9000000.0 +
              local_1538[0xc] * 7000000.0;
  dVar70 = local_1538[8] * 0.0 +
           (0.0 - ((local_1408 + dStack_1420) - (local_1418 + local_1438)) * 0.0006666666666666666)
           * -0.006485071999156734 * local_1538[0xe] * local_1538[0xb];
  dVar74 = local_1538[8] * 0.0 +
           (0.0 - ((dStack_1440 + local_1418) - (local_1418 + local_1438)) * 0.0006666666666666666)
           * -162396.0790401699 * local_1538[7] * local_1538[0xc];
  dVar332 = local_1538[8] * 14000000.0 + local_1538[0xe] * local_1538[0xb] * -0.006485071999156734;
  dVar243 = local_1538[8] * 7000000.0 + local_1538[7] * local_1538[0xc] * -162396.0790401699;
  local_1608[8] =
       (((((((local_1608[8] - dVar360) - dVar137) - dVar134) - dVar344) - dVar323) - dVar238) -
       dVar243) - dVar332;
  local_1608[7] = dVar134 + dVar265 + dVar238 + dVar243;
  local_1608[0xc] = (local_1608[0xc] + dVar313) - dVar332;
  dVar243 = local_1538[10] * 19371657.71343335;
  dVar238 = local_1538[0xc] * 14000000.0;
  local_c30 = dVar243 + dVar243 + ((dVar217 + (local_c30 - dVar326)) - dVar237);
  local_c38 = (((((((((((((local_c38 - dVar246) - dVar179) + dVar326) -
                       local_1538[0x13] * 12265169.958139507) - local_1538[0x14] * 7359101.974883704
                      ) - dVar350) - dVar234) - dVar217) - local_1538[5] * 30000000.0) - dVar237) -
                dVar243) - local_1538[0xb] * 9000000.0) - local_1538[0xc] * 7000000.0) - dVar238;
  dVar246 = dVar238 + dVar234 + dVar350 + (double)local_c28._8_8_;
  local_c28._8_4_ = SUB84(dVar246,0);
  local_c28._0_8_ = (double)local_c28._0_8_ - dVar243;
  local_c28._12_4_ = (int)((ulong)dVar246 >> 0x20);
  local_c18 = local_c18 - dVar238;
  local_c08 = dVar238 + dVar179 + local_c08;
  dStack_350 = dVar29 + dStack_350 + dVar260 + dVar74;
  dVar246 = ((((((((((local_348 - dVar242) - dVar118) - dVar71) - dVar248) - dVar95) - dVar29) -
               dVar348) - dVar288) - dVar260) - dVar74) - dVar70;
  auVar13._8_4_ = SUB84(dVar246,0);
  auVar13._0_8_ = dStack_350;
  auVar13._12_4_ = (int)((ulong)dVar246 >> 0x20);
  local_348 = auVar13._8_8_;
  dStack_328 = (dVar112 + dVar329) - dVar70;
  auVar47._8_4_ = SUB84(local_1538[0xf],0);
  auVar47._0_8_ = local_1538[0x11];
  auVar47._12_4_ = (int)((ulong)local_1538[0xf] >> 0x20);
  dVar246 = local_1538[0xf] * -86596485.19199125;
  adStack_1150[0x19] =
       dVar281 + ((((((((((((adStack_1150[0x19] - dVar129) - dVar212) - dVar22) - dVar214) - dVar278
                        ) - dVar300) - dVar349) - dVar335) - dVar340) - dVar130) - dVar143) -
                 dVar239) + dVar362 + dVar226 + dVar246;
  adStack_1150[0x1b] = adStack_1150[0x1b] - (dVar226 + dVar226);
  adStack_1150[0x1a] = dVar373 - dVar246;
  local_1050 = ((local_1050 - dVar278) + dVar300 + dVar130 + dVar143) - dVar246;
  local_1020 = dVar246 + local_1020;
  dVar349 = local_1538[3] * local_1538[9] * 1793.8203338395704 +
            local_1538[4] * local_1538[0xe] * -4.52122891906719e-05;
  dVar22 = local_1538[3] * local_1538[9] * 3.5866496754579007 +
           (0.001999447552130754 -
           ((local_1408 + local_1458) - (dStack_1430 + dStack_1460)) * 0.0006666666666666666) *
           -4.52122891906719e-05 * local_1538[4] * local_1538[0xe];
  dVar212 = local_1538[9] * 1793.8203338395704;
  dVar362 = local_1538[9] * 1703.2356556327686;
  local_fd8 = dVar338 + dVar362;
  dStack_fc8 = dStack_fc8 + dVar110 + dVar264 + dVar212;
  local_fa0 = ((local_fa0 - dVar252) - dVar362) - dVar212;
  dVar338 = (dStack_f78 - dVar221) + dVar212;
  auVar48._8_4_ = SUB84(dStack_f70 + dVar362,0);
  auVar48._0_8_ = dVar338;
  auVar48._12_4_ = (int)((ulong)(dStack_f70 + dVar362) >> 0x20);
  dStack_f70 = auVar48._8_8_;
  dVar246 = local_1538[0xe] * -4.52122891906719e-05;
  dStack_f18 = dVar330 + (((((((((((((dVar23 + dVar23 + dStack_f18 + dVar99) - dVar284) -
                                   (dVar370 + dVar370)) - dVar103) - dVar114) - dVar364) - dVar325)
                              - dVar73) - dVar97) - dVar115) - dVar105) - dVar375) - dVar176) +
                         dVar107 + dVar116 + dVar322 + dVar347 + dVar246;
  local_f20 = (((dVar282 + dVar103) - dVar330) - dVar347) - dVar246;
  local_ef0 = (((((local_ef0 + dVar293 + dVar99) - dVar325) - dVar73) + dVar97) - dVar116) - dVar246
  ;
  dStack_ec0 = auVar10._8_8_;
  local_ec8 = dVar246 + dVar342;
  dVar325 = local_1538[3] * 1793.8203338395704;
  dStack_ba8 = auVar90._8_8_;
  local_1538[4] = local_1538[4] * -4.52122891906719e-05;
  local_838 = ((((local_838 + dVar213) - dVar166) - dVar169) - dVar296) + dVar162 + local_1538[4];
  dVar246 = local_1538[0x11] * -159545083.58041438;
  adStack_1150[2] =
       (((((((((adStack_1150[2] + dVar251 + dVar354 + dVar361 + dVar277 + dVar333) - dVar240) -
             dVar371) - dVar256) - dVar257) - dVar270) - dVar318) - dVar133) - dVar224) + dVar225 +
       dVar301 + dVar378 + dVar376 + dVar366 + dVar337 + dVar368 + dVar132 + dVar236 + dVar246;
  adStack_1150[10] = adStack_1150[10] - (dVar246 + dVar246);
  adStack_1150[0x12] = dVar246 + adStack_1150[0x12] + dVar224;
  dVar239 = local_1538[9] * 592052.8885504483;
  dVar243 = local_1538[3] * 1703.2356556327686;
  local_b50 = dVar243 + (local_b50 - dVar19) + dVar266;
  dStack_ba8 = dStack_ba8 + dVar325;
  local_bb0 = ((local_bb0 + dVar26) - dVar243) - dVar325;
  local_bc0 = local_2c8 + dVar367 + dVar235 + dVar320 + dVar239;
  dStack_bb8 = ((((dStack_bb8 - dVar51) - dVar279) - dVar131) - dVar144) + dVar243;
  local_1288 = (dStack_b40 - dVar144) + dVar239;
  dVar240 = local_1538[2] * -86596485.19199125;
  dStack_1690 = auVar47._8_8_;
  dVar300 = local_1538[1] * -159545083.58041438;
  local_798 = local_798 + dVar240;
  local_760 = ((local_760 + dVar223) - dVar117) - dVar240;
  dVar246 = local_1538[9] * local_1538[9] * 721.5278371512255 +
            (0.00243737629223557 -
            ((dStack_1470 + dStack_13f0) - (dStack_1430 + dStack_1430)) * 0.0006666666666666666) *
            -159545083.58041438 * local_1538[0x11] * local_1538[1];
  dVar333 = local_1538[3] * local_1538[9] * 10.970836066652648 +
            (0.006441173322300416 -
            ((dStack_1400 + local_1468) - (dStack_1430 + dStack_1460)) * 0.0006666666666666666) *
            -86596485.19199125 * dStack_1690 * local_1538[2];
  dVar376 = local_1538[9] * local_1538[9] * 296026.4442752242 +
            local_1538[0x11] * local_1538[1] * -159545083.58041438;
  dVar378 = local_1538[3] * local_1538[9] * 1703.2356556327686 +
            dStack_1690 * local_1538[2] * -86596485.19199125;
  local_1608[1] =
       (((((((((local_1608[1] + dVar289 + dVar72 + dVar363 + dVar369 + dVar377) - dVar94) - dVar15)
            - dVar317) - dVar294) - dVar303) - dVar178) - dVar164) - dVar165) + dVar295 + dVar24 +
       dVar336 + dVar147 + dVar231 + dVar283 + dVar290 + dVar137 + dVar344 + dVar376;
  local_1608[2] =
       ((((((((((((local_1608[2] - dVar289) - dVar52) - dVar72) - dVar363) - dVar369) - dVar174) -
            dVar372) - dVar377) - dVar280) - dVar254) - dVar268) - dVar356) + dVar315 + dVar94 +
       dVar341 + dVar378;
  local_12a8 = dVar376 + dVar27 + (local_1608[0x11] - dVar268) + dVar356 + dVar165;
  local_640 = (local_640 - dVar20) + dVar300;
  dVar277 = (((((((((((((double)local_380._8_8_ - dVar92) - dVar292) - dVar302) - dVar93) - dVar113)
                  - dVar216) - dVar334) - dVar339) - dVar355) - dVar175) - dVar183) - dVar245) +
            dVar255 + dVar163 + dVar328 + dVar333;
  local_380._8_4_ = SUB84(dVar277,0);
  local_380._0_8_ =
       ((((((((((double)local_380._0_8_ + dVar267 + dVar92 + dVar302 + dVar93 + dVar113 + dVar339) -
              dVar163) - dVar316) - dVar177) - dVar18) - dVar241) - dVar56) - dVar258) - dVar100) +
       dVar135 + dVar271 + dVar319 + dVar75 + dVar182 + dVar141 + dVar71 + dVar95 + dVar348 +
       dVar246;
  local_380._12_4_ = (int)((ulong)dVar277 >> 0x20);
  local_1298 = ((double)local_300._0_8_ - dVar183) + dVar245 + dVar100 + dVar108 + dVar246;
  dVar326 = local_1538[9] * local_1538[0xd] * 26480000.0 +
            local_1538[10] * local_1538[0xb] * -0.0002710754168835943;
  dVar19 = local_1538[9] * local_1538[0xd] * 0.0 +
           (0.0 - ((dStack_1420 + local_1428) - (dStack_1430 + dStack_1410)) * 0.0006666666666666666
           ) * -0.0002710754168835943 * local_1538[10] * local_1538[0xb];
  dVar301 = local_1538[0xd] * 26480000.0;
  local_b70 = local_b70 + dVar301;
  dVar371 = local_1538[0xb] * -0.0002710754168835943;
  local_ac0 = local_ac0 + dVar371;
  dVar241 = local_1538[10] * -0.0002710754168835943;
  local_a20 = local_a20 - dVar241;
  dVar267 = dVar241 + dVar359 + dVar233 + (dVar138 - dVar28) + dVar345;
  auVar49._8_4_ = SUB84(dVar267,0);
  auVar49._0_8_ = dVar241 + local_a18;
  auVar49._12_4_ = (int)((ulong)dVar267 >> 0x20);
  local_a18 = dVar241 + local_a18;
  dStack_a10 = auVar49._8_8_;
  dVar97 = local_1538[0xe] * 390998.5057150522;
  local_b60 = ((local_b60 + dVar131) - dVar301) + dVar97;
  dStack_b58 = (dVar325 + dVar51 + dStack_b58 + dVar144) - dVar97;
  dVar176 = local_1538[0xd] * -2156.4740241498666;
  local_ab0 = (local_ab0 - dVar371) + dVar176;
  local_aa8 = local_aa8 - dVar176;
  dVar342 = local_1538[9] * 26480000.0;
  dVar29 = local_1538[10] * -2156.4740241498666;
  dVar289 = local_1538[0xe] * local_1538[9] * 390998.5057150522 +
            local_1538[10] * local_1538[0xd] * -2156.4740241498666;
  dVar23 = local_1538[0xe] * local_1538[9] * 1244.9131168262245 +
           (0.003183933182940293 -
           ((local_1428 + dStack_1410) - (dStack_1430 + local_1408)) * 0.0006666666666666666) *
           -2156.4740241498666 * local_1538[10] * local_1538[0xd];
  local_8c0 = ((local_8c0 + dVar247) - dVar342) - dVar29;
  local_8b8 = dVar29 + local_8b8 + dVar342;
  dVar267 = dVar342 + dStack_8b0 + dVar352 + dVar374 + dVar65;
  auVar127._8_4_ = SUB84(dVar267,0);
  auVar127._0_8_ = local_8b8;
  auVar127._12_4_ = (int)((ulong)dVar267 >> 0x20);
  local_898 = ((((local_898 - dVar54) - dVar222) - dVar357) - dVar180) - dVar29;
  dStack_1360 = local_1538[10];
  dVar266 = local_1538[9] * 390998.5057150522;
  local_810 = (((local_810 - dVar215) + dVar218) - local_1538[4]) - dVar266;
  local_808 = local_808 + dVar266;
  local_7f0 = local_7f0 + dVar213 + dVar353 + dVar53 + dVar296 + dVar266;
  local_13c8 = local_b38;
  dVar267 = local_1538[10] * -5603.460820379699;
  local_600 = ((local_600 + dVar219) - (dVar300 + dVar300)) - dVar267;
  local_5f8 = local_5f8 + dVar267;
  local_5b8 = (((local_5b8 - dVar314) - dVar20) - dVar261) - dVar267;
  dVar277 = local_1538[3] * 1923289.8439964922;
  local_1258._8_8_ = 0;
  local_1258._0_8_ = local_1538[3];
  dVar278 = local_1538[9] * 61950.158398051455;
  local_550 = local_550 - dVar278;
  local_548 = local_548 + dVar278;
  local_510 = local_510 + dVar220 + dVar57 + dVar67 + dVar278;
  local_508 = (((local_508 - dVar220) - dVar57) - dVar67) - dVar278;
  dVar278 = local_1538[6] * -132.4388903689313;
  local_a50 = (((local_a50 - dVar276) - dVar233) - dVar359) - dVar278;
  local_a38 = (local_a38 - dVar28) + dVar278;
  dStack_a10 = dStack_a10 + dVar278;
  dStack_a00 = ((((dStack_a00 - dVar211) - dVar98) - dVar146) - dVar241) - dVar278;
  dVar211 = local_1538[3] * 6645614.320408218;
  local_8f0 = ((local_8f0 - dVar222) - dVar297) - dVar211;
  local_8d8 = local_8d8 + dVar222 + dVar211;
  dStack_8b0 = auVar127._8_8_;
  dStack_8b0 = dStack_8b0 + dVar211;
  local_8a0 = (((dVar297 +
                (((((((dVar249 + dVar50 + local_8a0) - dVar352) - dVar352) + dVar54 + dVar247 +
                   dVar222) - dVar374) + dVar357) - dVar65) + dVar180) - dVar342) + dVar29) -
              dVar211;
  dVar278 = local_1538[3] * local_1538[0xd] * 594.5215787626531 +
            (8.946074058750579e-05 -
            ((dStack_1420 + local_1448) - (dStack_1410 + dStack_1460)) * 0.0006666666666666666) *
            -132.4388903689313 * local_1538[6] * local_1538[0xb];
  dVar247 = local_1538[0xf] * local_1538[3] * 8226.248452056829 +
            (0.0042771756309819275 -
            ((local_1408 + local_1448) - (dStack_1400 + dStack_1460)) * 0.0006666666666666666) *
            -43.301595906050935 * local_1538[0xe] * local_1538[6];
  dVar211 = local_1538[0xd] * 6645614.320408218;
  dVar249 = local_1538[0xf] * 1923289.8439964922;
  local_f90 = dVar287 + dVar264 + (local_f90 - dVar55) + dVar211;
  local_f80 = (dVar110 + local_f80 + dVar221) - dVar211;
  dVar338 = dVar249 + dVar338;
  auVar14._8_4_ = SUB84(dVar338,0);
  auVar14._0_8_ = local_f80;
  auVar14._12_4_ = (int)((ulong)dVar338 >> 0x20);
  dStack_f78 = auVar14._8_8_;
  local_1228._0_8_ =
       (((((dStack_fb8 - dVar291) + dVar221) - dVar343) - dVar227) - dVar252) + dVar211 + dVar249;
  dStack_f70 = dStack_f70 - dVar249;
  dVar338 = local_1538[0xb] * -132.4388903689313;
  dVar342 = local_1538[0xe] * -43.301595906050935;
  local_d80 = (local_d80 - dVar230) + dVar338;
  local_d70 = (local_d70 + dVar96) - dVar338;
  dStack_d60 = auVar44._8_8_;
  dStack_d60 = dStack_d60 - dVar342;
  dStack_d68 = dVar342 + dVar69;
  dVar352 = local_1538[6] * -43.301595906050935;
  local_840 = ((local_840 - dVar353) - local_1538[4]) - dVar352;
  local_828 = dVar106 + dVar352;
  local_7e8 = ((local_1538[4] +
               dVar299 + dVar162 + ((dVar169 +
                                    (((((dVar215 + local_7e8) - dVar213) + dVar218) - dVar353) -
                                    dVar53) + dVar166) - dVar296)) - dVar266) + dVar352;
  local_7e0 = local_7e0 - dVar352;
  local_790 = (local_790 - dVar240) - dVar277;
  local_778 = (local_778 - dVar117) + dVar277;
  local_738 = local_738 + dVar277;
  local_730 = (dVar240 + dVar117 + (local_730 - dVar223)) - dVar277;
  dStack_330 = dVar248 + dVar71 + (((dStack_330 - dVar75) + dVar66) - dVar112) + dVar70 + dVar19 +
               dVar278;
  dVar213 = local_1538[3] * local_1538[0xd] * 6645614.320408218 +
            local_1538[6] * local_1538[0xb] * -132.4388903689313;
  dVar276 = local_1538[0xf] * local_1538[3] * 1923289.8439964922 +
            local_1538[0xe] * local_1538[6] * -43.301595906050935;
  local_1608[0xb] = dVar360 + (dVar181 - dVar313) + dVar290 + dVar332 + dVar326 + dVar213;
  local_1608[0xd] = ((dStack_1290 - dVar326) + dVar289) - dVar213;
  dVar352 = dVar276 + ((dVar349 +
                       dVar332 + ((dVar336 +
                                  (((dVar268 + ((dVar369 + local_1608[0xe]) - dVar280)) - dVar327) -
                                  dVar178) + dVar24) - dVar168) + dVar21) - dVar289);
  auVar128._8_4_ = SUB84(dVar352,0);
  auVar128._0_8_ = local_1608[0xd];
  auVar128._12_4_ = (int)((ulong)dVar352 >> 0x20);
  local_1608[0xe] = auVar128._8_8_;
  local_1608[0xf] = (dVar378 + dVar262 + (local_1608[0xf] - dVar164)) - dVar276;
  dStack_320 = (((dVar263 + dVar365) - dVar19) + dVar23) - dVar278;
  dVar352 = dVar247 + ((dVar22 + dStack_1640 +
                                 ((dVar271 + ((((dStack_318 - dVar355) + dVar183) - dVar269) -
                                             dVar56) + dVar319) - dVar285) + dVar70) - dVar23);
  auVar91._8_4_ = SUB84(dVar352,0);
  auVar91._0_8_ = dStack_320;
  auVar91._12_4_ = (int)((ulong)dVar352 >> 0x20);
  dStack_318 = auVar91._8_8_;
  local_310 = (dVar333 + dVar232 + (local_310 - dVar258)) - dVar247;
  dVar352 = local_1538[6] * -5461.432196104055;
  local_1368 = local_d50;
  local_6e0 = local_6e0 - dVar352;
  local_6c8 = local_6c8 + dVar352;
  local_678 = dVar250 + dVar63 + (local_678 - dVar244) + dVar352;
  local_670 = local_670 - dVar352;
  dVar244 = local_1538[3] * 228932.11193603993;
  local_630 = local_630 - dVar244;
  dVar352 = local_1538[0x12] * 61950.158398051455;
  local_b80 = ((((((dVar62 + dVar62 +
                   ((dVar235 + dVar358 + dVar358 + (local_1270 - dVar367)) - dVar320)) - dVar243) -
                 dVar325) - (dVar239 + dVar239)) - dVar301) - dVar97) - dVar352;
  local_b78 = ((((((local_b78 - dVar279) - dVar16) - dVar167) + dVar26) - dVar358) - dVar62) +
              dVar301 + dVar97 + dVar352;
  dStack_b40 = local_1288 + dVar352;
  local_b38 = local_b38 - dVar352;
  dVar352 = local_1538[0x11] * -5603.460820379699;
  local_ad0 = (((dVar58 + dVar58 +
                dVar142 + dVar142 + ((local_ad0 + dVar253 + dVar17 + dVar104) - dVar148)) - dVar371)
              - dVar176) - dVar352;
  local_ac8 = (local_1210 - dVar58) + dVar371 + dVar176 + dVar352;
  local_a90 = local_a90 + dVar352;
  local_a88 = local_a88 - dVar352;
  dVar352 = local_1538[3] * local_1538[0x11] * 198.4042264437053 +
            (0.0008666509244414622 -
            ((local_1448 + local_13f8) - (dStack_13f0 + dStack_1460)) * 0.0006666666666666666) *
            -5461.432196104055 * local_1538[6] * local_1538[0x10];
  dVar277 = local_1538[9] * local_1538[0x12] * 216.6497304178424 +
            (0.0034971618478485886 -
            ((local_1428 + dStack_13f0) - (local_13e8 + dStack_1430)) * 0.0006666666666666666) *
            -5603.460820379699 * local_1538[10] * local_1538[0x11];
  local_340 = ((((((dVar288 + dVar288 +
                   ((dVar95 + dVar324 + dVar324 +
                              ((dVar182 +
                               (((((((local_340 - dVar113) + dVar216 + dVar175 + dVar183 + dVar18 +
                                    dVar258) - dVar346) - dVar25) + dVar228) - dVar140) - dVar232))
                              - dVar141)) - dVar348)) - dVar333) - dVar22) - (dVar246 + dVar246)) -
               dVar19) - dVar23) - dVar277;
  local_338 = ((local_1208 - dVar324) - dVar288) + dVar19 + dVar23 + dVar277;
  dVar246 = local_1538[3] * local_1538[0x11] * 228932.11193603993 +
            local_1538[6] * local_1538[0x10] * -5461.432196104055;
  dVar332 = local_1538[9] * local_1538[0x12] * 61950.158398051455 +
            local_1538[10] * local_1538[0x11] * -5603.460820379699;
  local_1608[10] = ((local_1608[10] - dVar59) - dVar323) + dVar326 + dVar289 + dVar332;
  local_1608[9] =
       ((((((dVar323 + dVar323 +
            ((dVar137 + dVar59 + dVar59 + ((dVar109 + dVar231) - dVar283)) - dVar344)) - dVar378) -
          dVar349) - (dVar376 + dVar376)) - dVar326) - dVar289) - dVar332;
  local_1608[4] =
       (((((((((((((dVar317 + dVar317 +
                    dVar94 + local_1608[4] + dVar174 + dVar372 + dVar280 + dVar356 + dVar164) -
                  dVar295) - (dVar341 + dVar341)) - dVar312) - dVar24) - dVar336) - dVar136) -
            dVar145) - dVar64) - dVar147) - dVar139) - dVar168) - dVar27) + dVar21 + dVar262 +
       dVar313 + dVar331 + dVar290 + dVar349;
  local_1608[3] =
       ((((((((((((dVar52 + local_1608[3]) - dVar315) - dVar327) - dVar94) + dVar15 + dVar312 +
              dStack_13a0) - dVar331) - dVar290) - dVar360) - dVar378) - dVar349) - dVar213) -
       dVar276) - dVar246;
  local_1608[6] =
       ((((dVar60 - dVar21) - dStack_13a0) - dVar262) - dVar313) + dVar213 + dVar276 + dVar246;
  local_1608[0x10] = dVar344 + dVar283 + (local_1608[0x10] - dVar254) + dVar246;
  local_1608[0x11] = (dVar332 + local_12a8) - dVar246;
  local_1608[0x12] = (((local_1608[0x12] - dVar356) - dVar165) - dVar27) - dVar332;
  local_1538[0x11] = local_1538[0x11] * 228932.11193603993;
  dStack_fd0 = ((((((((dVar227 + dStack_fd0 + dVar252) - dVar110) - dVar264) - dVar287) - dVar362) -
                 dVar212) - dVar211) - dVar249) - local_1538[0x11];
  dStack_fb8 = (double)local_1228._0_8_ + local_1538[0x11];
  local_f68 = local_f68 + local_1538[0x11];
  local_f60 = local_f60 - local_1538[0x11];
  local_1538[0x10] = local_1538[0x10] * -5461.432196104055;
  dStack_db8 = dStack_db8 + dVar76 + dVar321 + dVar230;
  local_dc0 = (((dVar102 + dVar68) - dVar338) - dVar342) - local_1538[0x10];
  dStack_da8 = ((((dStack_da8 - dVar76) - dVar68) - dVar321) - dVar230) + dVar338 + dVar342 +
               local_1538[0x10];
  local_db0 = local_db0 + dVar101;
  local_d58 = local_d58 + local_1538[0x10];
  local_d50 = local_d50 - local_1538[0x10];
  local_618 = local_618 + dVar244;
  local_5c8 = local_5c8 + dVar244;
  local_5c0 = ((local_5c0 - dVar219) + dVar314 + dVar20 + dVar261 + dVar300 + dVar267) - dVar244;
  dStack_368 = (((((((((((((dVar177 + dVar177 +
                            dVar163 + dStack_368 + dVar216 + dVar334 + dVar355 + dVar245 + dVar258)
                          - dVar135) - (dVar328 + dVar328)) - dVar259) - dVar271) - dVar319) -
                     dVar346) - dVar25) - dVar228) - dVar75) - dVar66) - dVar285) - dVar108) +
               dVar149 + dVar232 + dVar112 + dVar263 + dVar71 + dVar22;
  local_370 = ((((((((((((dVar292 + local_370) - dVar255) - dVar269) - dVar163) + dVar316 + dVar259
                     + dVar140) - dVar263) - dVar71) - dVar248) - dVar333) - dVar22) - dVar278) -
              dVar247) - dVar352;
  local_358 = dVar61 + dVar278 + dVar247 + dVar352;
  local_308 = dVar348 + dVar141 + (local_308 - dVar175) + dVar352;
  dVar211 = ((((double)local_300._8_8_ - dVar245) - dVar100) - dVar108) - dVar277;
  local_300._8_4_ = SUB84(dVar211,0);
  local_300._0_8_ = (dVar277 + local_1298) - dVar352;
  local_300._12_4_ = (int)((ulong)dVar211 >> 0x20);
  if (local_11fc == 0) {
    local_268[0] = 2.8822959451999997;
    local_268[1] = 1.4999999982659773;
    local_268[2] = 1.507252090419375;
    local_268[3] = 3.398993884662499;
    local_268[4] = 2.9627907471999997;
    local_268[5] = 4.687841430575;
    local_268[6] = 5.2821630604062495;
    local_268[7] = 4.97163097458125;
    local_268[8] = 4.98750050771875;
    local_268[9] = 7.198434206537501;
    local_268[10] = 9.874274296874997;
    local_268[0xb] = 3.2349510160250006;
    local_268[0xc] = 6.023470866475001;
    local_268[0xd] = 5.33591319330625;
    local_268[0xe] = 7.5590570047500005;
    local_268[0xf] = 9.825474777499998;
    local_268[0x10] = 12.2373674399375;
    local_268[0x11] = 14.246951215250002;
    local_268[0x12] = 16.552933378125;
    local_268[0x13] = 3.1861203930625;
    local_1b8[0] = 0.000507239459;
    local_1b8[1] = 1.4767295125000317e-13;
    local_1b8[2] = -1.116620304e-05;
    local_1b8[3] = 0.00033054475434999984;
    local_1b8[4] = 0.0004928155568499999;
    local_1b8[5] = 0.0012567384129500002;
    local_1b8[6] = 0.0009643321552500001;
    local_1b8[7] = 0.0009323347502999997;
    local_1b8[8] = 0.0009823763672500007;
    local_1b8[9] = 0.0016686828392500003;
    local_1b8[10] = 0.0030726129075;
    local_1b8[0xb] = 0.00034398350740000034;
    local_1b8[0xc] = 0.0006661732772499996;
    local_1b8[0xd] = 0.0007601921039999995;
    local_1b8[0xe] = 0.0015323131260000008;
    local_1b8[0xf] = 0.0022796327649999997;
    local_1b8[0x10] = 0.0027535931289999994;
    local_1b8[0x11] = 0.0032581048315000038;
    local_1b8[0x12] = 0.0039887186525;
    local_1b8[0x13] = 0.00037292862650000006;
    local_1b8[0x14] = 0.0;
    local_268[0x14] = 1.5;
    local_d8 = 1.9101473600491665;
    uVar199 = 0x97324360;
    uVar200 = 0x4000a2a8;
    uVar201 = 0x1bfd44f3;
    uVar202 = 0x3ff00ca1;
    uVar203 = 0xae46b97;
    uVar204 = 0x4031ea25;
    uVar205 = 0x6b14455a;
    uVar206 = 0x4006ffa0;
    uVar207 = 0xcd68d3ff;
    uVar208 = 0x401c50aa;
    uVar209 = 0xb9f4c317;
    uVar210 = 0x4026ca5f;
    dVar211 = 6.7442483232375;
    dVar352 = -4.227135418966667;
    dVar267 = -6.748131844745;
    dVar312 = -27.605086887896665;
    uVar272 = 0xee250cf6;
    uVar273 = 0x40301d43;
    uVar274 = 0x3c488b69;
    uVar275 = 0xbfe214f1;
    dVar248 = 34.602608086557915;
    dVar212 = 37.543891960460414;
    dVar246 = -16.524086927680834;
    dVar249 = 4.3818731557687505;
    uVar304 = 0x919c8014;
    uVar305 = 0x40020b57;
    uVar306 = 0xd3fd44c6;
    uVar307 = 0x40146fd4;
    uVar308 = 0x2efd9734;
    uVar309 = 0x40327b81;
    uVar310 = 0xaf13a7dd;
    uVar311 = 0x403501f0;
    pdVar186 = local_d0;
    pdVar189 = local_c0;
    pdVar190 = local_b0;
    pdVar193 = local_a0;
    pdVar194 = local_90;
    pdVar196 = local_80;
    pdVar184 = local_70;
    pdVar197 = local_60;
    local_278 = local_290;
    local_280 = local_298;
  }
  else {
    local_268[0] = 3.8822959451999997;
    local_268[1] = 2.4999999982659773;
    local_268[2] = 2.507252090419375;
    local_268[3] = 4.398993884662499;
    local_268[4] = 3.9627907472;
    local_268[5] = 5.687841430575;
    local_268[6] = 6.28216306040625;
    local_268[7] = 5.971630974581251;
    local_268[8] = 5.98750050771875;
    local_268[9] = 8.1984342065375;
    local_268[10] = 10.874274296874997;
    local_268[0xb] = 4.234951016024999;
    local_268[0xc] = 7.023470866475001;
    local_268[0xd] = 6.33591319330625;
    local_268[0xe] = 8.55905700475;
    local_268[0xf] = 10.825474777499998;
    local_268[0x10] = 13.237367439937499;
    local_268[0x11] = 15.24695121525;
    local_268[0x12] = 17.552933378125;
    local_268[0x13] = 4.1861203930625;
    local_268[0x14] = 2.5;
    local_1b8[0] = 0.000507239459;
    uVar199 = 0x412ad30f;
    uVar200 = 0x3f3870b4;
    uVar201 = 0;
    uVar202 = 0;
    uVar203 = 0xb657eadc;
    uVar204 = 0x3f6ab0bd;
    uVar205 = 0x82a59cbf;
    uVar206 = 0x3f705679;
    uVar207 = 0x8585a725;
    uVar208 = 0x3f62acbc;
    uVar209 = 0xdeffcb6;
    uVar210 = 0x3f668eb4;
    dVar211 = 0.0007601921039999995;
    dVar352 = 0.0015323131260000008;
    dVar267 = 0.00034398350740000034;
    dVar312 = 0.0006661732772499996;
    uVar272 = 0x8e34d75f;
    uVar273 = 0x3f5b56f6;
    uVar274 = 0x7e6e6d8d;
    uVar275 = 0x3f692bbc;
    dVar248 = 0.0009323347502999997;
    dVar212 = 0.0009823763672500007;
    dVar246 = 0.0012567384129500002;
    dVar249 = 0.0009643321552500001;
    uVar304 = 0xe8e87ee7;
    uVar305 = 0x3f35a99e;
    uVar306 = 0x598d8058;
    uVar307 = 0x3f402609;
    uVar308 = 0x91b4691f;
    uVar309 = 0x3d44c87a;
    uVar310 = 0x42942cb3;
    uVar311 = 0xbee76acf;
    pdVar192 = &local_1478;
    pdVar186 = local_1b8 + 1;
    pdVar189 = local_1b8 + 3;
  }
  *(undefined4 *)pdVar186 = uVar308;
  *(undefined4 *)((long)pdVar186 + 4) = uVar309;
  *(undefined4 *)(pdVar186 + 1) = uVar310;
  *(undefined4 *)((long)pdVar186 + 0xc) = uVar311;
  *(undefined4 *)pdVar189 = uVar304;
  *(undefined4 *)((long)pdVar189 + 4) = uVar305;
  *(undefined4 *)(pdVar189 + 1) = uVar306;
  *(undefined4 *)((long)pdVar189 + 0xc) = uVar307;
  *pdVar190 = dVar246;
  pdVar190[1] = dVar249;
  *pdVar193 = dVar248;
  pdVar193[1] = dVar212;
  *(undefined4 *)pdVar194 = uVar272;
  *(undefined4 *)((long)pdVar194 + 4) = uVar273;
  *(undefined4 *)(pdVar194 + 1) = uVar274;
  *(undefined4 *)((long)pdVar194 + 0xc) = uVar275;
  *pdVar196 = dVar267;
  pdVar196[1] = dVar312;
  *pdVar184 = dVar211;
  pdVar184[1] = dVar352;
  *(undefined4 *)pdVar197 = uVar207;
  *(undefined4 *)((long)pdVar197 + 4) = uVar208;
  *(undefined4 *)(pdVar197 + 1) = uVar209;
  *(undefined4 *)((long)pdVar197 + 0xc) = uVar210;
  *(undefined4 *)local_278 = uVar203;
  *(undefined4 *)((long)local_278 + 4) = uVar204;
  *(undefined4 *)(local_278 + 1) = uVar205;
  *(undefined4 *)((long)local_278 + 0xc) = uVar206;
  *(undefined4 *)local_280 = uVar199;
  *(undefined4 *)((long)local_280 + 4) = uVar200;
  *(undefined4 *)(local_280 + 1) = uVar201;
  *(undefined4 *)((long)local_280 + 0xc) = uVar202;
  dVar211 = 0.0;
  dVar352 = 0.0;
  dVar267 = 0.0;
  dVar312 = 0.0;
  for (lVar198 = 0; lVar198 != 0xa8; lVar198 = lVar198 + 8) {
    dVar267 = dVar267 + *(double *)((long)local_1b8 + lVar198) *
                        *(double *)((long)local_1538 + lVar198);
    dVar248 = *(double *)((long)pdVar192 + lVar198);
    dVar211 = dVar211 + *(double *)((long)local_1538 + lVar198) *
                        *(double *)((long)local_268 + lVar198);
    dVar352 = dVar352 + *(double *)((long)local_1608 + lVar198) * dVar248;
    dVar312 = dVar312 + (*(double *)((long)local_268 + lVar198) - dVar248) * 0.0006666666666666666 *
                        *(double *)((long)local_1608 + lVar198) +
                        dVar248 * *(double *)(local_380 + lVar198 + -8);
  }
  dVar352 = dVar352 * (1.0 / dVar211);
  dVar248 = (1.0 / dVar211) * 1500.0;
  dVar211 = dVar352 * dVar248;
  dVar248 = -dVar248;
  for (lVar198 = 0; lVar198 != 0x15; lVar198 = lVar198 + 1) {
    dVar212 = 0.0;
    for (lVar191 = 0; lVar191 != 0x15; lVar191 = lVar191 + 1) {
      dVar212 = dVar212 + pdVar192[lVar191] * pdVar187[lVar191];
    }
    adStack_1150[lVar198 * 0x16] = local_268[lVar198] * dVar211 + dVar212 * dVar248;
    pdVar187 = pdVar187 + 0x16;
  }
  pdVar187 = &local_11f8;
  local_2e0 = dVar248 * dVar312 + (dVar211 * dVar267 - dVar352);
  *local_270 = 0;
  iVar188 = 0;
  lVar198 = 0;
  iVar195 = 0;
  do {
    if (lVar198 == 0x16) {
      return;
    }
    for (lVar191 = 0; lVar191 != 0x16; lVar191 = lVar191 + 1) {
      if (lVar198 == lVar191) {
        rowVals[iVar195] = (int)lVar198;
        indx[iVar195] = (int)lVar198 * 0x17;
LAB_0018da5d:
        iVar195 = iVar195 + 1;
      }
      else if ((pdVar187[lVar191] != 0.0) || (NAN(pdVar187[lVar191]))) {
        rowVals[iVar195] = (int)lVar191;
        indx[iVar195] = iVar188 + (int)lVar191;
        goto LAB_0018da5d;
      }
    }
    local_270[lVar198 + 1] = iVar195;
    lVar198 = lVar198 + 1;
    pdVar187 = pdVar187 + 0x16;
    iVar188 = iVar188 + 0x16;
  } while( true );
}

Assistant:

void
SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(
  int* rowVals, int* colPtrs, int* indx, const int* consP)
{
  amrex::GpuArray<amrex::Real, 484> Jac = {0.0};
  amrex::GpuArray<amrex::Real, 21> conc = {0.0};
  for (int n = 0; n < 21; n++) {
    conc[n] = 1.0 / 21.000000;
  }
  aJacobian_precond(&Jac[0], &conc[0], 1500.0, *consP);

  colPtrs[0] = 0;
  int nJdata_tmp = 0;
  for (int k = 0; k < 22; k++) {
    for (int l = 0; l < 22; l++) {
      if (k == l) {
        rowVals[nJdata_tmp] = l;
        indx[nJdata_tmp] = 22 * k + l;
        nJdata_tmp = nJdata_tmp + 1;
      } else {
        if (Jac[22 * k + l] != 0.0) {
          rowVals[nJdata_tmp] = l;
          indx[nJdata_tmp] = 22 * k + l;
          nJdata_tmp = nJdata_tmp + 1;
        }
      }
    }
    colPtrs[k + 1] = nJdata_tmp;
  }
}